

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rds_test.cc
# Opt level: O3

int main(void)

{
  pointer pcVar1;
  void *pvVar2;
  void *pvVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  RdsAddTagsToResourceRequestType *this;
  HttpTestListener *pHVar8;
  RdsCreateDBInstanceRequestType *pRVar9;
  HttpTestListener *pHVar10;
  RdsRemoveTagsFromResourceRequestType *this_00;
  HttpTestListener *pHVar11;
  undefined8 extraout_RAX;
  pointer pRVar12;
  RdsAddTagsToResourceResponseType resp;
  RdsAddTagsToResourceRequestType req;
  RdsCreateDBInstanceResponseType resp_13;
  undefined7 *local_418;
  undefined8 local_410;
  undefined7 local_408;
  undefined1 uStack_401;
  undefined1 uStack_400;
  undefined2 uStack_3ff;
  undefined1 local_3fd;
  long *local_3f8;
  undefined8 local_3f0;
  long local_3e8;
  ushort local_3e0;
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [40];
  undefined1 local_390 [16];
  undefined1 local_380 [24];
  undefined1 local_368 [40];
  undefined1 local_340 [24];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined1 local_308 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  string local_2a8 [8];
  _Alloc_hider local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  string local_288 [8];
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  string local_268 [8];
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  string local_248 [8];
  undefined1 local_240 [24];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  undefined1 local_1e0 [24];
  _Alloc_hider local_1c8;
  undefined1 local_1c0 [24];
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [24];
  _Alloc_hider local_188;
  undefined1 local_180 [24];
  _Alloc_hider local_168;
  undefined1 local_160 [8];
  undefined1 local_158 [16];
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  char *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  _Base_ptr local_98;
  undefined1 local_90 [16];
  _Alloc_hider local_80;
  _Base_ptr local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  pcVar1 = local_368 + 0x10;
  local_368._8_8_ = (pointer)0x0;
  local_368[0x10] = '\0';
  local_368._32_8_ = local_340 + 8;
  local_340._0_8_ = (pointer)0x0;
  local_340[8] = '\0';
  local_328._0_8_ = &local_318;
  local_328._8_8_ = (pointer)0x0;
  local_318._M_local_buf[0] = '\0';
  local_308._0_8_ = &local_2f8;
  local_308._8_8_ = (pointer)0x0;
  local_2f8._M_local_buf[0] = '\0';
  local_2e8._0_8_ = &local_2d8;
  local_2e8._8_8_ = (pointer)0x0;
  local_2d8._M_local_buf[0] = '\0';
  local_2c8._M_allocated_capacity = (size_type)&local_2b8;
  local_2c8._8_8_ = (_Base_ptr)0x0;
  local_2b8._M_local_buf[0] = '\0';
  local_2a8 = (string  [8])&local_298;
  local_2a0._M_p = (pointer)0x0;
  local_298._M_local_buf[0] = '\0';
  local_288 = (string  [8])&local_278;
  local_280._M_p = (pointer)0x0;
  local_278._M_local_buf[0] = '\0';
  local_268 = (string  [8])&local_258;
  local_260._M_p = (pointer)0x0;
  local_258._M_local_buf[0] = '\0';
  local_248 = (string  [8])(local_240 + 8);
  local_240._0_8_ = 0;
  local_240[8] = '\0';
  local_228._0_8_ = &local_218;
  local_228._8_8_ = 0;
  local_218._M_local_buf[0] = '\0';
  local_208._0_8_ = &local_1f8;
  local_208._8_8_ = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8._M_p = local_1e0 + 8;
  local_1e0._0_8_ = 0;
  local_1e0[8] = '\0';
  local_1c8._M_p = local_1c0 + 8;
  local_1c0._0_8_ = 0;
  local_1c0[8] = '\0';
  local_1a8._M_p = local_1a0 + 8;
  local_1a0._0_8_ = 0;
  local_1a0[8] = '\0';
  local_188._M_p = local_180 + 8;
  local_180._0_8_ = 0;
  local_180[8] = '\0';
  pHVar10 = (HttpTestListener *)local_158;
  local_160 = (undefined1  [8])0x0;
  local_158[0] = false;
  local_d8[0] = 'c';
  local_d8._1_6_ = 0x676e61682d6e;
  local_d8[7] = 'z';
  local_d8[8] = 'h';
  local_d8._9_2_ = 0x756f;
  local_e8._8_8_ = (undefined1 *)0xb;
  local_d8[0xb] = '\0';
  local_408 = 0x697070615f796d;
  uStack_401 = 100;
  local_410 = 8;
  uStack_400 = 0;
  local_3e8 = 0x65726365735f796d;
  local_3e0 = 0x74;
  local_3f0 = 9;
  local_418 = &local_408;
  local_3f8 = &local_3e8;
  local_368._0_8_ = pcVar1;
  local_168._M_p = (pointer)pHVar10;
  local_e8._M_allocated_capacity = (size_type)local_d8;
  this = (RdsAddTagsToResourceRequestType *)
         aliyun::Rds::CreateRdsClient(&local_e8,&local_418,&local_3f8);
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8,local_3e8 + 1);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
  }
  if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
    operator_delete((void *)local_e8._M_allocated_capacity,
                    CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
  }
  if (this == (RdsAddTagsToResourceRequestType *)0x0) {
    aliyun::RdsAddTagsToResourceRequestType::~RdsAddTagsToResourceRequestType
              ((RdsAddTagsToResourceRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011b7d4;
    aliyun::RdsAllocateInstancePrivateConnectionRequestType::
    ~RdsAllocateInstancePrivateConnectionRequestType
              ((RdsAllocateInstancePrivateConnectionRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011b955;
    aliyun::RdsAllocateInstancePublicConnectionRequestType::
    ~RdsAllocateInstancePublicConnectionRequestType
              ((RdsAllocateInstancePublicConnectionRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011bad6;
    aliyun::RdsBatchGrantAccountPrivilegeRequestType::~RdsBatchGrantAccountPrivilegeRequestType
              ((RdsBatchGrantAccountPrivilegeRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011bc6b;
    aliyun::RdsBatchRevokeAccountPrivilegeRequestType::~RdsBatchRevokeAccountPrivilegeRequestType
              ((RdsBatchRevokeAccountPrivilegeRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011bdec;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011bf59;
    aliyun::RdsCheckAccountNameAvailableRequestType::~RdsCheckAccountNameAvailableRequestType
              ((RdsCheckAccountNameAvailableRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011c0da;
    aliyun::RdsCheckDBNameAvailableRequestType::~RdsCheckDBNameAvailableRequestType
              ((RdsCheckDBNameAvailableRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011c25b;
    aliyun::RdsCreateAccountRequestType::~RdsCreateAccountRequestType
              ((RdsCreateAccountRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011c3f0;
    aliyun::RdsCreateAccountForInnerRequestType::~RdsCreateAccountForInnerRequestType
              ((RdsCreateAccountForInnerRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011c5ad;
    aliyun::RdsCreateBackupRequestType::~RdsCreateBackupRequestType
              ((RdsCreateBackupRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this = (RdsAddTagsToResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this != (RdsAddTagsToResourceRequestType *)0x0) goto LAB_0011c742;
    aliyun::RdsCreateDatabaseRequestType::~RdsCreateDatabaseRequestType
              ((RdsCreateDatabaseRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    pHVar8 = (HttpTestListener *)aliyun::Rds::CreateRdsClient(&local_e8);
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (pHVar8 != (HttpTestListener *)0x0) goto LAB_0011c8d7;
    aliyun::RdsCreateDatabaseForInnerRequestType::~RdsCreateDatabaseForInnerRequestType
              ((RdsCreateDatabaseForInnerRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_1e8._M_p = local_1e0 + 8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    local_1c8._M_p = local_1c0 + 8;
    local_1c0._0_8_ = 0;
    local_1c0[8] = '\0';
    local_1a8._M_p = local_1a0 + 8;
    local_1a0._0_8_ = 0;
    local_1a0[8] = '\0';
    local_188._M_p = local_180 + 8;
    local_180._0_8_ = 0;
    local_180[8] = '\0';
    local_160 = (undefined1  [8])0x0;
    local_158[0] = false;
    local_148._M_p = (pointer)&local_138;
    local_140 = 0;
    local_138._M_local_buf[0] = '\0';
    local_128._M_allocated_capacity = (size_type)&local_118;
    local_128._8_8_ = 0;
    local_118._M_local_buf[0] = '\0';
    local_108._M_allocated_capacity = (size_type)&local_f8;
    local_108._8_8_ = 0;
    local_f8._M_local_buf[0] = '\0';
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_b8 = (char *)((ulong)local_b8 & 0xffffffffffffff00);
    local_a0._M_p = (pointer)0x0;
    local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
    local_80._M_p = (pointer)0x0;
    local_78 = (_Base_ptr)((ulong)local_78 & 0xffffffffffffff00);
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    pHVar8 = (HttpTestListener *)local_380;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = pHVar8;
    local_368._0_8_ = pcVar1;
    local_168._M_p = (pointer)pHVar10;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    local_b0._8_8_ = (_Base_ptr)&local_98;
    local_90._8_8_ = (HttpTestListener *)&local_78;
    pRVar9 = (RdsCreateDBInstanceRequestType *)
             aliyun::Rds::CreateRdsClient(&local_418,&local_3f8,local_390);
    local_380._16_8_ = pRVar9;
    if ((HttpTestListener *)local_390._0_8_ != pHVar8) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    pHVar10 = (HttpTestListener *)&local_78;
    if (pRVar9 != (RdsCreateDBInstanceRequestType *)0x0) goto LAB_0011caaa;
    if ((HttpTestListener *)local_90._8_8_ != (HttpTestListener *)&local_78) {
      operator_delete((void *)local_90._8_8_,(ulong)((long)&local_78->_M_color + 1));
    }
    if ((_Base_ptr)local_b0._8_8_ != (_Base_ptr)&local_98) {
      operator_delete((void *)local_b0._8_8_,(ulong)((long)&local_98->_M_color + 1));
    }
    if ((char **)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8 + 1));
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsCreateDBInstanceRequestType::~RdsCreateDBInstanceRequestType
              ((RdsCreateDBInstanceRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_1e8._M_p = local_1e0 + 8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    local_1c8._M_p = local_1c0 + 8;
    local_1c0._0_8_ = 0;
    local_1c0[8] = '\0';
    local_1a8._M_p = local_1a0 + 8;
    local_1a0._0_8_ = 0;
    local_1a0[8] = '\0';
    local_188._M_p = local_180 + 8;
    local_180._0_8_ = 0;
    local_180[8] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    local_c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_b8 = (char *)((ulong)local_b8 & 0xffffffffffffff00);
    local_a0._M_p = (pointer)0x0;
    local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
    local_80._M_p = (pointer)0x0;
    local_78 = (_Base_ptr)((ulong)local_78 & 0xffffffffffffff00);
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    pHVar8 = (HttpTestListener *)local_380;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = pHVar8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    local_b0._8_8_ = (_Base_ptr)&local_98;
    local_90._8_8_ = (HttpTestListener *)&local_78;
    pRVar9 = (RdsCreateDBInstanceRequestType *)aliyun::Rds::CreateRdsClient();
    local_380._16_8_ = pRVar9;
    if ((HttpTestListener *)local_390._0_8_ != pHVar8) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (pRVar9 != (RdsCreateDBInstanceRequestType *)0x0) goto LAB_0011cd45;
    if ((HttpTestListener *)local_90._8_8_ != (HttpTestListener *)&local_78) {
      operator_delete((void *)local_90._8_8_,(ulong)((long)&local_78->_M_color + 1));
    }
    if ((_Base_ptr)local_b0._8_8_ != (_Base_ptr)&local_98) {
      operator_delete((void *)local_b0._8_8_,(ulong)((long)&local_98->_M_color + 1));
    }
    if ((char **)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8 + 1));
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsCreateDBInstanceForChannelRequestType::~RdsCreateDBInstanceForChannelRequestType
              ((RdsCreateDBInstanceForChannelRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_1e8._M_p = local_1e0 + 8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    local_c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_b8 = (char *)((ulong)local_b8 & 0xffffffffffffff00);
    local_a0._M_p = (pointer)0x0;
    local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    pHVar8 = (HttpTestListener *)local_380;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = pHVar8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    local_b0._8_8_ = (_Base_ptr)&local_98;
    pRVar9 = (RdsCreateDBInstanceRequestType *)aliyun::Rds::CreateRdsClient();
    local_380._16_8_ = pRVar9;
    if ((HttpTestListener *)local_390._0_8_ != pHVar8) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (pRVar9 != (RdsCreateDBInstanceRequestType *)0x0) goto LAB_0011cf90;
    if ((_Base_ptr)local_b0._8_8_ != (_Base_ptr)&local_98) {
      operator_delete((void *)local_b0._8_8_,(ulong)((long)&local_98->_M_color + 1));
    }
    if ((char **)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8 + 1));
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsCreateDBInstanceforFirstPayRequestType::~RdsCreateDBInstanceforFirstPayRequestType
              ((RdsCreateDBInstanceforFirstPayRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    local_c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_b8 = (char *)((ulong)local_b8 & 0xffffffffffffff00);
    local_a0._M_p = (pointer)0x0;
    local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
    local_80._M_p = (pointer)0x0;
    local_78 = (_Base_ptr)((ulong)local_78 & 0xffffffffffffff00);
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    pHVar8 = (HttpTestListener *)local_380;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = pHVar8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    local_b0._8_8_ = (_Base_ptr)&local_98;
    local_90._8_8_ = (HttpTestListener *)&local_78;
    pRVar9 = (RdsCreateDBInstanceRequestType *)aliyun::Rds::CreateRdsClient();
    local_380._16_8_ = pRVar9;
    if ((HttpTestListener *)local_390._0_8_ != pHVar8) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (pRVar9 != (RdsCreateDBInstanceRequestType *)0x0) goto LAB_0011d19f;
    if ((HttpTestListener *)local_90._8_8_ != (HttpTestListener *)&local_78) {
      operator_delete((void *)local_90._8_8_,(ulong)((long)&local_78->_M_color + 1));
    }
    if ((_Base_ptr)local_b0._8_8_ != (_Base_ptr)&local_98) {
      operator_delete((void *)local_b0._8_8_,(ulong)((long)&local_98->_M_color + 1));
    }
    if ((char **)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8 + 1));
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsCreatePostpaidDBInstanceRequestType::~RdsCreatePostpaidDBInstanceRequestType
              ((RdsCreatePostpaidDBInstanceRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    local_c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_b8 = (char *)((ulong)local_b8 & 0xffffffffffffff00);
    local_a0._M_p = (pointer)0x0;
    local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
    local_80._M_p = (pointer)0x0;
    local_78 = (_Base_ptr)((ulong)local_78 & 0xffffffffffffff00);
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    pHVar8 = (HttpTestListener *)local_380;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = pHVar8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    local_b0._8_8_ = (_Base_ptr)&local_98;
    local_90._8_8_ = (HttpTestListener *)&local_78;
    pRVar9 = (RdsCreateDBInstanceRequestType *)aliyun::Rds::CreateRdsClient();
    local_380._16_8_ = pRVar9;
    if ((HttpTestListener *)local_390._0_8_ != pHVar8) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (pRVar9 != (RdsCreateDBInstanceRequestType *)0x0) goto LAB_0011d39a;
    if ((HttpTestListener *)local_90._8_8_ != (HttpTestListener *)&local_78) {
      operator_delete((void *)local_90._8_8_,(ulong)((long)&local_78->_M_color + 1));
    }
    if ((_Base_ptr)local_b0._8_8_ != (_Base_ptr)&local_98) {
      operator_delete((void *)local_b0._8_8_,(ulong)((long)&local_98->_M_color + 1));
    }
    if ((char **)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8 + 1));
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsCreatePostpaidDBInstanceForChannelRequestType::
    ~RdsCreatePostpaidDBInstanceForChannelRequestType
              ((RdsCreatePostpaidDBInstanceForChannelRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_1e8._M_p = local_1e0 + 8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    local_1c8._M_p = local_1c0 + 8;
    local_1c0._0_8_ = 0;
    local_1c0[8] = '\0';
    local_1a8._M_p = local_1a0 + 8;
    local_1a0._0_8_ = 0;
    local_1a0[8] = '\0';
    local_188._M_p = local_180 + 8;
    local_180._0_8_ = 0;
    local_180[8] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    local_c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_b8 = (char *)((ulong)local_b8 & 0xffffffffffffff00);
    local_a0._M_p = (pointer)0x0;
    local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
    local_80._M_p = (pointer)0x0;
    local_78 = (_Base_ptr)((ulong)local_78 & 0xffffffffffffff00);
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    pHVar8 = (HttpTestListener *)local_380;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = pHVar8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    local_b0._8_8_ = (_Base_ptr)&local_98;
    local_90._8_8_ = (HttpTestListener *)&local_78;
    pRVar9 = (RdsCreateDBInstanceRequestType *)aliyun::Rds::CreateRdsClient();
    local_380._16_8_ = pRVar9;
    if ((HttpTestListener *)local_390._0_8_ != pHVar8) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (pRVar9 != (RdsCreateDBInstanceRequestType *)0x0) goto LAB_0011d595;
    if ((HttpTestListener *)local_90._8_8_ != (HttpTestListener *)&local_78) {
      operator_delete((void *)local_90._8_8_,(ulong)((long)&local_78->_M_color + 1));
    }
    if ((_Base_ptr)local_b0._8_8_ != (_Base_ptr)&local_98) {
      operator_delete((void *)local_b0._8_8_,(ulong)((long)&local_98->_M_color + 1));
    }
    if ((char **)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8 + 1));
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsCreateReadOnlyDBInstanceRequestType::~RdsCreateReadOnlyDBInstanceRequestType
              ((RdsCreateReadOnlyDBInstanceRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    pHVar10 = (HttpTestListener *)local_380;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = pHVar10;
    local_368._0_8_ = local_368 + 0x10;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    pHVar8 = (HttpTestListener *)aliyun::Rds::CreateRdsClient();
    if ((HttpTestListener *)local_390._0_8_ != pHVar10) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (pHVar8 != (HttpTestListener *)0x0) goto LAB_0011d7e0;
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    pHVar8 = (HttpTestListener *)local_368;
    aliyun::RdsCreateTempDBInstanceRequestType::~RdsCreateTempDBInstanceRequestType
              ((RdsCreateTempDBInstanceRequestType *)pHVar8);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    pRVar12 = (pointer)0x80;
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_c8._8_8_ = &local_b0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_b8 = (char *)0x0;
    local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
    local_98 = (_Base_ptr)(local_90 + 8);
    local_90._0_8_ = (_Base_ptr)0x0;
    local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
    local_70._0_8_ = (_Base_ptr)0x0;
    local_70._8_8_ = local_70._8_8_ & 0xffffffffffffff00;
    local_60._16_8_ = 0;
    local_48._M_local_buf[0] = '\0';
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = (HttpTestListener *)local_380;
    local_368._0_8_ = local_368 + 0x10;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    local_78 = (_Base_ptr)(local_70 + 8);
    local_60._8_8_ = &local_48;
    pHVar10 = (HttpTestListener *)aliyun::Rds::CreateRdsClient();
    if ((HttpTestListener *)local_390._0_8_ != (HttpTestListener *)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (pHVar10 != (HttpTestListener *)0x0) goto LAB_0011d962;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._8_8_ != &local_48) {
      operator_delete((void *)local_60._8_8_,
                      CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
    }
    pcVar1 = local_368 + 0x10;
    pRVar12 = (pointer)local_380;
    if (local_78 != (_Base_ptr)(local_70 + 8)) {
      operator_delete(local_78,(ulong)(local_70._8_8_ + 1));
    }
    if (local_98 != (_Base_ptr)(local_90 + 8)) {
      operator_delete(local_98,(ulong)(local_90._8_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._8_8_ != &local_b0) {
      operator_delete((void *)local_c8._8_8_,(ulong)(local_b0._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011dad4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011dc39;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011dd9e;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = pRVar12;
    local_368._0_8_ = pcVar1;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011df03;
    std::
    vector<aliyun::RdsDescibeImportsFromDatabaseImportResultFromDBType,_std::allocator<aliyun::RdsDescibeImportsFromDatabaseImportResultFromDBType>_>
    ::~vector((vector<aliyun::RdsDescibeImportsFromDatabaseImportResultFromDBType,_std::allocator<aliyun::RdsDescibeImportsFromDatabaseImportResultFromDBType>_>
               *)&local_e8);
    aliyun::RdsDescibeImportsFromDatabaseRequestType::~RdsDescibeImportsFromDatabaseRequestType
              ((RdsDescibeImportsFromDatabaseRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = pRVar12;
    local_368._0_8_ = pcVar1;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011e0e7;
    std::
    vector<aliyun::RdsDescribeAbnormalDBInstancesInstanceResultType,_std::allocator<aliyun::RdsDescribeAbnormalDBInstancesInstanceResultType>_>
    ::~vector((vector<aliyun::RdsDescribeAbnormalDBInstancesInstanceResultType,_std::allocator<aliyun::RdsDescribeAbnormalDBInstancesInstanceResultType>_>
               *)&local_e8);
    aliyun::RdsDescribeAbnormalDBInstancesRequestType::~RdsDescribeAbnormalDBInstancesRequestType
              ((RdsDescribeAbnormalDBInstancesRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_3b8._16_8_ = (pointer)0x0;
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (pointer)0x0;
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3f0 = 9;
    local_3e0 = 0x74;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient(&local_e8);
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011e28f;
    std::
    vector<aliyun::RdsDescribeAccountsDBInstanceAccountType,_std::allocator<aliyun::RdsDescribeAccountsDBInstanceAccountType>_>
    ::~vector((vector<aliyun::RdsDescribeAccountsDBInstanceAccountType,_std::allocator<aliyun::RdsDescribeAccountsDBInstanceAccountType>_>
               *)local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_d8[8] = '\0';
    local_c8._8_8_ = &local_b0;
    local_b8 = (char *)0x0;
    local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
    local_98 = (_Base_ptr)0x0;
    local_90._0_8_ = local_90._0_8_ & 0xffffffffffffff00;
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = (pointer)local_380;
    local_368._0_8_ = pcVar1;
    local_e8._8_8_ = local_d8 + 8;
    local_a0._M_p = (pointer)local_90;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011e3f9;
    if ((_Base_ptr)local_a0._M_p != (_Base_ptr)local_90) {
      operator_delete(local_a0._M_p,(ulong)(local_90._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._8_8_ != &local_b0) {
      operator_delete((void *)local_c8._8_8_,(ulong)(local_b0._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_e8._8_8_ != local_d8 + 8) {
      operator_delete((void *)local_e8._8_8_,
                      CONCAT44(local_d8._12_4_,
                               CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8]))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_1e8._M_p = local_1e0 + 8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    pvVar2 = (void *)((long)&local_c8 + 8);
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[8] = SUB81(pvVar2,0);
    uVar4 = local_d8[8];
    local_d8._9_2_ = (undefined2)((ulong)pvVar2 >> 8);
    uVar5 = local_d8._9_2_;
    local_d8[0xb] = (undefined1)((ulong)pvVar2 >> 0x18);
    uVar6 = local_d8[0xb];
    local_d8._12_4_ = (undefined4)((ulong)pvVar2 >> 0x20);
    uVar7 = local_d8._12_4_;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_b0._M_allocated_capacity = (size_type)&local_a0;
    local_b0._8_8_ = (_Base_ptr)0x0;
    local_a0._M_p = local_a0._M_p & 0xffffffffffffff00;
    local_90._0_8_ = &local_80;
    local_90._8_8_ = (HttpTestListener *)0x0;
    local_80._M_p = local_80._M_p & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = (pointer)local_380;
    local_368._0_8_ = pcVar1;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011e551;
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)&local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._M_p + 1));
    }
    if ((_Alloc_hider *)local_b0._M_allocated_capacity != &local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity,(ulong)(local_a0._M_p + 1));
    }
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeBackupsBackupType,_std::allocator<aliyun::RdsDescribeBackupsBackupType>_>
    ::~vector((vector<aliyun::RdsDescribeBackupsBackupType,_std::allocator<aliyun::RdsDescribeBackupsBackupType>_>
               *)&local_e8);
    aliyun::RdsDescribeBackupsRequestType::~RdsDescribeBackupsRequestType
              ((RdsDescribeBackupsRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_3b8._16_8_ = (pointer)0x0;
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3f0 = 9;
    local_3e0 = 0x74;
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (pointer)0x0;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient(&local_e8);
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011e749;
    std::
    vector<aliyun::RdsDescribeBackupTasksBackupJobType,_std::allocator<aliyun::RdsDescribeBackupTasksBackupJobType>_>
    ::~vector((vector<aliyun::RdsDescribeBackupTasksBackupJobType,_std::allocator<aliyun::RdsDescribeBackupTasksBackupJobType>_>
               *)local_3b8);
    aliyun::RdsDescribeBackupTasksRequestType::~RdsDescribeBackupTasksRequestType
              ((RdsDescribeBackupTasksRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011e90b;
    std::
    vector<aliyun::RdsDescribeBinlogFilesBinLogFileType,_std::allocator<aliyun::RdsDescribeBinlogFilesBinLogFileType>_>
    ::~vector((vector<aliyun::RdsDescribeBinlogFilesBinLogFileType,_std::allocator<aliyun::RdsDescribeBinlogFilesBinLogFileType>_>
               *)&local_e8);
    aliyun::RdsDescribeBinlogFilesRequestType::~RdsDescribeBinlogFilesRequestType
              ((RdsDescribeBinlogFilesRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_3b8._16_8_ = (pointer)0x0;
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3f0 = 9;
    local_3e0 = 0x74;
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (pointer)0x0;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient(&local_e8);
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011eab3;
    std::
    vector<aliyun::RdsDescribeDatabasesDatabaseType,_std::allocator<aliyun::RdsDescribeDatabasesDatabaseType>_>
    ::~vector((vector<aliyun::RdsDescribeDatabasesDatabaseType,_std::allocator<aliyun::RdsDescribeDatabasesDatabaseType>_>
               *)local_3b8);
    aliyun::RdsDescribeDatabasesRequestType::~RdsDescribeDatabasesRequestType
              ((RdsDescribeDatabasesRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_3b8._16_8_ = (pointer)0x0;
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (pointer)0x0;
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3f0 = 9;
    local_3e0 = 0x74;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011ec39;
    std::
    vector<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>_>
    ::~vector((vector<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType,_std::allocator<aliyun::RdsDescribeDBInstanceAttributeDBInstanceAttributeType>_>
               *)local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_3b8._16_8_ = (pointer)0x0;
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (pointer)0x0;
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3f0 = 9;
    local_3e0 = 0x74;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011edab;
    std::
    vector<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType,_std::allocator<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType>_>
    ::~vector((vector<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType,_std::allocator<aliyun::RdsDescribeDBInstanceIPArrayListDBInstanceIPArrayType>_>
               *)local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011ef09;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeDBInstanceNetInfoDBInstanceNetInfoType,_std::allocator<aliyun::RdsDescribeDBInstanceNetInfoDBInstanceNetInfoType>_>
    ::~vector((vector<aliyun::RdsDescribeDBInstanceNetInfoDBInstanceNetInfoType,_std::allocator<aliyun::RdsDescribeDBInstanceNetInfoDBInstanceNetInfoType>_>
               *)&local_e8);
    aliyun::RdsDescribeDBInstanceNetInfoRequestType::~RdsDescribeDBInstanceNetInfoRequestType
              ((RdsDescribeDBInstanceNetInfoRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011f089;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeDBInstanceNetInfoForChannelDBInstanceNetInfoType,_std::allocator<aliyun::RdsDescribeDBInstanceNetInfoForChannelDBInstanceNetInfoType>_>
    ::~vector((vector<aliyun::RdsDescribeDBInstanceNetInfoForChannelDBInstanceNetInfoType,_std::allocator<aliyun::RdsDescribeDBInstanceNetInfoForChannelDBInstanceNetInfoType>_>
               *)&local_e8);
    aliyun::RdsDescribeDBInstanceNetInfoForChannelRequestType::
    ~RdsDescribeDBInstanceNetInfoForChannelRequestType
              ((RdsDescribeDBInstanceNetInfoForChannelRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_b0._M_allocated_capacity = (size_type)&local_a0;
    local_b0._8_8_ = (_Base_ptr)0x0;
    local_a0._M_p = local_a0._M_p & 0xffffffffffffff00;
    local_90._0_8_ = &local_80;
    local_90._8_8_ = (HttpTestListener *)0x0;
    local_80._M_p = local_80._M_p & 0xffffffffffffff00;
    local_70._8_8_ = (_Base_ptr)0x0;
    local_60[0] = _S_red;
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    local_70._0_8_ = (_Base_ptr)local_60;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011f209;
    if ((_Base_ptr)local_70._0_8_ != (_Base_ptr)local_60) {
      operator_delete((void *)local_70._0_8_,CONCAT71(local_60._1_7_,local_60[0]) + 1);
    }
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)&local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._M_p + 1));
    }
    if ((_Alloc_hider *)local_b0._M_allocated_capacity != &local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity,(ulong)(local_a0._M_p + 1));
    }
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeDBInstancePerformancePerformanceKeyType,_std::allocator<aliyun::RdsDescribeDBInstancePerformancePerformanceKeyType>_>
    ::~vector((vector<aliyun::RdsDescribeDBInstancePerformancePerformanceKeyType,_std::allocator<aliyun::RdsDescribeDBInstancePerformancePerformanceKeyType>_>
               *)&local_e8);
    aliyun::RdsDescribeDBInstancePerformanceRequestType::
    ~RdsDescribeDBInstancePerformanceRequestType
              ((RdsDescribeDBInstancePerformanceRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_1e8._M_p = local_1e0 + 8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    local_1c8._M_p = local_1c0 + 8;
    local_1c0._0_8_ = 0;
    local_1c0[8] = '\0';
    local_1a8._M_p = local_1a0 + 8;
    local_1a0._0_8_ = 0;
    local_1a0[8] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011f3b1;
    std::
    vector<aliyun::RdsDescribeDBInstancesDBInstanceType,_std::allocator<aliyun::RdsDescribeDBInstancesDBInstanceType>_>
    ::~vector((vector<aliyun::RdsDescribeDBInstancesDBInstanceType,_std::allocator<aliyun::RdsDescribeDBInstancesDBInstanceType>_>
               *)&local_e8);
    aliyun::RdsDescribeDBInstancesRequestType::~RdsDescribeDBInstancesRequestType
              ((RdsDescribeDBInstancesRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011f5d1;
    std::
    vector<aliyun::RdsDescribeDBInstancesByExpireTimeDBInstanceExpireTimeType,_std::allocator<aliyun::RdsDescribeDBInstancesByExpireTimeDBInstanceExpireTimeType>_>
    ::~vector((vector<aliyun::RdsDescribeDBInstancesByExpireTimeDBInstanceExpireTimeType,_std::allocator<aliyun::RdsDescribeDBInstancesByExpireTimeDBInstanceExpireTimeType>_>
               *)&local_e8);
    aliyun::RdsDescribeDBInstancesByExpireTimeRequestType::
    ~RdsDescribeDBInstancesByExpireTimeRequestType
              ((RdsDescribeDBInstancesByExpireTimeRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011f779;
    std::
    vector<aliyun::RdsDescribeDBInstancesByPerformanceDBInstancePerformanceType,_std::allocator<aliyun::RdsDescribeDBInstancesByPerformanceDBInstancePerformanceType>_>
    ::~vector((vector<aliyun::RdsDescribeDBInstancesByPerformanceDBInstancePerformanceType,_std::allocator<aliyun::RdsDescribeDBInstancesByPerformanceDBInstancePerformanceType>_>
               *)&local_e8);
    aliyun::RdsDescribeDBInstancesByPerformanceRequestType::
    ~RdsDescribeDBInstancesByPerformanceRequestType
              ((RdsDescribeDBInstancesByPerformanceRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011f949;
    std::
    vector<aliyun::RdsDescribeErrorLogsErrorLogType,_std::allocator<aliyun::RdsDescribeErrorLogsErrorLogType>_>
    ::~vector((vector<aliyun::RdsDescribeErrorLogsErrorLogType,_std::allocator<aliyun::RdsDescribeErrorLogsErrorLogType>_>
               *)&local_e8);
    aliyun::RdsDescribeErrorLogsRequestType::~RdsDescribeErrorLogsRequestType
              ((RdsDescribeErrorLogsRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011faf1;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeFilesForSQLServerSQLServerUploadFileType,_std::allocator<aliyun::RdsDescribeFilesForSQLServerSQLServerUploadFileType>_>
    ::~vector((vector<aliyun::RdsDescribeFilesForSQLServerSQLServerUploadFileType,_std::allocator<aliyun::RdsDescribeFilesForSQLServerSQLServerUploadFileType>_>
               *)&local_e8);
    aliyun::RdsDescribeFilesForSQLServerRequestType::~RdsDescribeFilesForSQLServerRequestType
              ((RdsDescribeFilesForSQLServerRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011fc99;
    std::
    vector<aliyun::RdsDescribeImportsForSQLServerSQLServerImportType,_std::allocator<aliyun::RdsDescribeImportsForSQLServerSQLServerImportType>_>
    ::~vector((vector<aliyun::RdsDescribeImportsForSQLServerSQLServerImportType,_std::allocator<aliyun::RdsDescribeImportsForSQLServerSQLServerImportType>_>
               *)&local_e8);
    aliyun::RdsDescribeImportsForSQLServerRequestType::~RdsDescribeImportsForSQLServerRequestType
              ((RdsDescribeImportsForSQLServerRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_b0._M_allocated_capacity = (size_type)&local_a0;
    local_b0._8_8_ = (_Base_ptr)0x0;
    local_a0._M_p = local_a0._M_p & 0xffffffffffffff00;
    local_90._0_8_ = &local_80;
    local_90._8_8_ = (HttpTestListener *)0x0;
    local_80._M_p = local_80._M_p & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011fe55;
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)&local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._M_p + 1));
    }
    if ((_Alloc_hider *)local_b0._M_allocated_capacity != &local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity,(ulong)(local_a0._M_p + 1));
    }
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeModifyParameterLogParameterChangeLogType,_std::allocator<aliyun::RdsDescribeModifyParameterLogParameterChangeLogType>_>
    ::~vector((vector<aliyun::RdsDescribeModifyParameterLogParameterChangeLogType,_std::allocator<aliyun::RdsDescribeModifyParameterLogParameterChangeLogType>_>
               *)&local_e8);
    aliyun::RdsDescribeModifyParameterLogRequestType::~RdsDescribeModifyParameterLogRequestType
              ((RdsDescribeModifyParameterLogRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0011fffd;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeOperationLogsOperationlogType,_std::allocator<aliyun::RdsDescribeOperationLogsOperationlogType>_>
    ::~vector((vector<aliyun::RdsDescribeOperationLogsOperationlogType,_std::allocator<aliyun::RdsDescribeOperationLogsOperationlogType>_>
               *)&local_e8);
    aliyun::RdsDescribeOperationLogsRequestType::~RdsDescribeOperationLogsRequestType
              ((RdsDescribeOperationLogsRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001201cd;
    std::
    vector<aliyun::RdsDescribeOptimizeAdviceByDBAAdviceByDBAType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceByDBAAdviceByDBAType>_>
    ::~vector((vector<aliyun::RdsDescribeOptimizeAdviceByDBAAdviceByDBAType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceByDBAAdviceByDBAType>_>
               *)&local_e8);
    aliyun::RdsDescribeOptimizeAdviceByDBARequestType::~RdsDescribeOptimizeAdviceByDBARequestType
              ((RdsDescribeOptimizeAdviceByDBARequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012034d;
    std::
    vector<aliyun::RdsDescribeOptimizeAdviceOnBigTableAdviceOnBigTableType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnBigTableAdviceOnBigTableType>_>
    ::~vector((vector<aliyun::RdsDescribeOptimizeAdviceOnBigTableAdviceOnBigTableType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnBigTableAdviceOnBigTableType>_>
               *)&local_e8);
    aliyun::RdsDescribeOptimizeAdviceOnBigTableRequestType::
    ~RdsDescribeOptimizeAdviceOnBigTableRequestType
              ((RdsDescribeOptimizeAdviceOnBigTableRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001204cd;
    std::
    vector<aliyun::RdsDescribeOptimizeAdviceOnExcessIndexAdviceOnExcessIndexType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnExcessIndexAdviceOnExcessIndexType>_>
    ::~vector((vector<aliyun::RdsDescribeOptimizeAdviceOnExcessIndexAdviceOnExcessIndexType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnExcessIndexAdviceOnExcessIndexType>_>
               *)&local_e8);
    aliyun::RdsDescribeOptimizeAdviceOnExcessIndexRequestType::
    ~RdsDescribeOptimizeAdviceOnExcessIndexRequestType
              ((RdsDescribeOptimizeAdviceOnExcessIndexRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012064d;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeOptimizeAdviceOnMissIndexAdviceOnMissIndexType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnMissIndexAdviceOnMissIndexType>_>
    ::~vector((vector<aliyun::RdsDescribeOptimizeAdviceOnMissIndexAdviceOnMissIndexType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnMissIndexAdviceOnMissIndexType>_>
               *)&local_e8);
    aliyun::RdsDescribeOptimizeAdviceOnMissIndexRequestType::
    ~RdsDescribeOptimizeAdviceOnMissIndexRequestType
              ((RdsDescribeOptimizeAdviceOnMissIndexRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001207cd;
    std::
    vector<aliyun::RdsDescribeOptimizeAdviceOnMissPKAdviceOnMissPKType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnMissPKAdviceOnMissPKType>_>
    ::~vector((vector<aliyun::RdsDescribeOptimizeAdviceOnMissPKAdviceOnMissPKType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnMissPKAdviceOnMissPKType>_>
               *)&local_e8);
    aliyun::RdsDescribeOptimizeAdviceOnMissPKRequestType::
    ~RdsDescribeOptimizeAdviceOnMissPKRequestType
              ((RdsDescribeOptimizeAdviceOnMissPKRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012094d;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeOptimizeAdviceOnStorageAdviceOnStorageType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnStorageAdviceOnStorageType>_>
    ::~vector((vector<aliyun::RdsDescribeOptimizeAdviceOnStorageAdviceOnStorageType,_std::allocator<aliyun::RdsDescribeOptimizeAdviceOnStorageAdviceOnStorageType>_>
               *)&local_e8);
    aliyun::RdsDescribeOptimizeAdviceOnStorageRequestType::
    ~RdsDescribeOptimizeAdviceOnStorageRequestType
              ((RdsDescribeOptimizeAdviceOnStorageRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_d8[8] = '\0';
    local_d8._9_2_ = 0;
    local_d8[0xb] = '\0';
    local_d8._12_4_ = 0;
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_b0._M_allocated_capacity = 0;
    local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
    local_98 = (_Base_ptr)(local_90 + 8);
    local_90._0_8_ = (_Base_ptr)0x0;
    local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
    local_418 = &local_408;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_b8 = local_b0._M_local_buf + 8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00120acd;
    if (local_98 != (_Base_ptr)(local_90 + 8)) {
      operator_delete(local_98,(ulong)(local_90._8_8_ + 1));
    }
    if (local_b8 != local_b0._M_local_buf + 8) {
      operator_delete(local_b8,(ulong)(local_b0._8_8_ + 1));
    }
    std::
    vector<aliyun::RdsDescribeParametersDBInstanceParameterType,_std::allocator<aliyun::RdsDescribeParametersDBInstanceParameterType>_>
    ::~vector((vector<aliyun::RdsDescribeParametersDBInstanceParameterType,_std::allocator<aliyun::RdsDescribeParametersDBInstanceParameterType>_>
               *)(local_d8 + 8));
    std::
    vector<aliyun::RdsDescribeParametersDBInstanceParameterType,_std::allocator<aliyun::RdsDescribeParametersDBInstanceParameterType>_>
    ::~vector((vector<aliyun::RdsDescribeParametersDBInstanceParameterType,_std::allocator<aliyun::RdsDescribeParametersDBInstanceParameterType>_>
               *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_b0._M_allocated_capacity = (size_type)&local_a0;
    local_b0._8_8_ = (_Base_ptr)0x0;
    local_a0._M_p = local_a0._M_p & 0xffffffffffffff00;
    local_90._0_8_ = &local_80;
    local_90._8_8_ = (HttpTestListener *)0x0;
    local_80._M_p = local_80._M_p & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00120c39;
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)&local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._M_p + 1));
    }
    if ((_Alloc_hider *)local_b0._M_allocated_capacity != &local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity,(ulong)(local_a0._M_p + 1));
    }
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeParameterTemplatesTemplateRecordType,_std::allocator<aliyun::RdsDescribeParameterTemplatesTemplateRecordType>_>
    ::~vector((vector<aliyun::RdsDescribeParameterTemplatesTemplateRecordType,_std::allocator<aliyun::RdsDescribeParameterTemplatesTemplateRecordType>_>
               *)&local_e8);
    aliyun::RdsDescribeParameterTemplatesRequestType::~RdsDescribeParameterTemplatesRequestType
              ((RdsDescribeParameterTemplatesRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00120db9;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribePreCheckResultsPreCheckResultType,_std::allocator<aliyun::RdsDescribePreCheckResultsPreCheckResultType>_>
    ::~vector((vector<aliyun::RdsDescribePreCheckResultsPreCheckResultType,_std::allocator<aliyun::RdsDescribePreCheckResultsPreCheckResultType>_>
               *)&local_e8);
    aliyun::RdsDescribePreCheckResultsRequestType::~RdsDescribePreCheckResultsRequestType
              ((RdsDescribePreCheckResultsRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00120f39;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType,_std::allocator<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType>_>
    ::~vector((vector<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType,_std::allocator<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType>_>
               *)&local_e8);
    aliyun::RdsDescribeRealtimeDiagnosesRequestType::~RdsDescribeRealtimeDiagnosesRequestType
              ((RdsDescribeRealtimeDiagnosesRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_3b8._16_8_ = (pointer)0x0;
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (pointer)0x0;
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3f0 = 9;
    local_3e0 = 0x74;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient(&local_e8);
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001210e1;
    std::
    vector<aliyun::RdsDescribeRegionsRDSRegionType,_std::allocator<aliyun::RdsDescribeRegionsRDSRegionType>_>
    ::~vector((vector<aliyun::RdsDescribeRegionsRDSRegionType,_std::allocator<aliyun::RdsDescribeRegionsRDSRegionType>_>
               *)local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    local_c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_b8 = (char *)((ulong)local_b8 & 0xffffffffffffff00);
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = (pointer)local_380;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012123f;
    if ((char **)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8 + 1));
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = (pointer)local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001213ab;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeSlowLogRecordsSQLSlowRecordType,_std::allocator<aliyun::RdsDescribeSlowLogRecordsSQLSlowRecordType>_>
    ::~vector((vector<aliyun::RdsDescribeSlowLogRecordsSQLSlowRecordType,_std::allocator<aliyun::RdsDescribeSlowLogRecordsSQLSlowRecordType>_>
               *)&local_e8);
    aliyun::RdsDescribeSlowLogRecordsRequestType::~RdsDescribeSlowLogRecordsRequestType
              ((RdsDescribeSlowLogRecordsRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_b0._M_allocated_capacity = (size_type)&local_a0;
    local_b0._8_8_ = (_Base_ptr)0x0;
    local_a0._M_p = local_a0._M_p & 0xffffffffffffff00;
    local_90._0_8_ = &local_80;
    local_90._8_8_ = (HttpTestListener *)0x0;
    local_80._M_p = local_80._M_p & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = (pointer)local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012157b;
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)&local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._M_p + 1));
    }
    if ((_Alloc_hider *)local_b0._M_allocated_capacity != &local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity,(ulong)(local_a0._M_p + 1));
    }
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeSlowLogsSQLSlowLogType,_std::allocator<aliyun::RdsDescribeSlowLogsSQLSlowLogType>_>
    ::~vector((vector<aliyun::RdsDescribeSlowLogsSQLSlowLogType,_std::allocator<aliyun::RdsDescribeSlowLogsSQLSlowLogType>_>
               *)&local_e8);
    aliyun::RdsDescribeSlowLogsRequestType::~RdsDescribeSlowLogsRequestType
              ((RdsDescribeSlowLogsRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = (pointer)local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012174b;
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeSQLInjectionInfosSQLInjectionInfoType,_std::allocator<aliyun::RdsDescribeSQLInjectionInfosSQLInjectionInfoType>_>
    ::~vector((vector<aliyun::RdsDescribeSQLInjectionInfosSQLInjectionInfoType,_std::allocator<aliyun::RdsDescribeSQLInjectionInfosSQLInjectionInfoType>_>
               *)&local_e8);
    aliyun::RdsDescribeSQLInjectionInfosRequestType::~RdsDescribeSQLInjectionInfosRequestType
              ((RdsDescribeSQLInjectionInfosRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = (pointer)local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001218f3;
    std::
    vector<aliyun::RdsDescribeSQLLogRecordsSQLRecordType,_std::allocator<aliyun::RdsDescribeSQLLogRecordsSQLRecordType>_>
    ::~vector((vector<aliyun::RdsDescribeSQLLogRecordsSQLRecordType,_std::allocator<aliyun::RdsDescribeSQLLogRecordsSQLRecordType>_>
               *)&local_e8);
    aliyun::RdsDescribeSQLLogRecordsRequestType::~RdsDescribeSQLLogRecordsRequestType
              ((RdsDescribeSQLLogRecordsRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = (pointer)local_380;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00121ad7;
    std::
    vector<aliyun::RdsDescribeSQLLogReportListItemType,_std::allocator<aliyun::RdsDescribeSQLLogReportListItemType>_>
    ::~vector((vector<aliyun::RdsDescribeSQLLogReportListItemType,_std::allocator<aliyun::RdsDescribeSQLLogReportListItemType>_>
               *)&local_e8);
    aliyun::RdsDescribeSQLLogReportListRequestType::~RdsDescribeSQLLogReportListRequestType
              ((RdsDescribeSQLLogReportListRequestType *)local_368);
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_c8._M_allocated_capacity = 0;
    local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
    local_b0._M_allocated_capacity = (size_type)&local_a0;
    local_b0._8_8_ = (_Base_ptr)0x0;
    local_a0._M_p = local_a0._M_p & 0xffffffffffffff00;
    local_90._0_8_ = &local_80;
    local_90._8_8_ = (HttpTestListener *)0x0;
    local_80._M_p = local_80._M_p & 0xffffffffffffff00;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = (pointer)local_380;
    local_d8[8] = uVar4;
    local_d8._9_2_ = uVar5;
    local_d8[0xb] = uVar6;
    local_d8._12_4_ = uVar7;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00121c7f;
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)&local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._M_p + 1));
    }
    pcVar1 = local_368 + 0x10;
    if ((_Alloc_hider *)local_b0._M_allocated_capacity != &local_a0) {
      operator_delete((void *)local_b0._M_allocated_capacity,(ulong)(local_a0._M_p + 1));
    }
    pvVar3 = (void *)CONCAT44(local_d8._12_4_,
                              CONCAT13(local_d8[0xb],CONCAT21(local_d8._9_2_,local_d8[8])));
    if (pvVar3 != pvVar2) {
      operator_delete(pvVar3,local_c8._8_8_ + 1);
    }
    std::
    vector<aliyun::RdsDescribeSQLLogReportsSQLReportType,_std::allocator<aliyun::RdsDescribeSQLLogReportsSQLReportType>_>
    ::~vector((vector<aliyun::RdsDescribeSQLLogReportsSQLReportType,_std::allocator<aliyun::RdsDescribeSQLLogReportsSQLReportType>_>
               *)&local_e8);
    aliyun::RdsDescribeSQLLogReportsRequestType::~RdsDescribeSQLLogReportsRequestType
              ((RdsDescribeSQLLogReportsRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_d8[0] = '\0';
    local_d8._1_6_ = 0;
    local_d8[7] = '\0';
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = (undefined1 *)0x0;
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    pRVar12 = (pointer)local_380;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = pRVar12;
    local_368._0_8_ = pcVar1;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00121e4f;
    std::
    vector<aliyun::RdsDescribeTasksTaskProgressInfoType,_std::allocator<aliyun::RdsDescribeTasksTaskProgressInfoType>_>
    ::~vector((vector<aliyun::RdsDescribeTasksTaskProgressInfoType,_std::allocator<aliyun::RdsDescribeTasksTaskProgressInfoType>_>
               *)&local_e8);
    aliyun::RdsDescribeTasksRequestType::~RdsDescribeTasksRequestType
              ((RdsDescribeTasksRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_3b8._16_8_ = (pointer)0x0;
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3f0 = 9;
    local_3e0 = 0x74;
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = (pointer)0x0;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient(&local_e8);
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012201f;
    std::
    vector<aliyun::RdsDescribeVpcZoneNosVpcZoneIdType,_std::allocator<aliyun::RdsDescribeVpcZoneNosVpcZoneIdType>_>
    ::~vector((vector<aliyun::RdsDescribeVpcZoneNosVpcZoneIdType,_std::allocator<aliyun::RdsDescribeVpcZoneNosVpcZoneIdType>_>
               *)local_3b8);
    aliyun::RdsDescribeVpcZoneNosRequestType::~RdsDescribeVpcZoneNosRequestType
              ((RdsDescribeVpcZoneNosRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = pRVar12;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012219d;
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsExtractBackupFromOASRequestType::~RdsExtractBackupFromOASRequestType
              ((RdsExtractBackupFromOASRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012231d;
    aliyun::RdsGrantAccountPrivilegeRequestType::~RdsGrantAccountPrivilegeRequestType
              ((RdsGrantAccountPrivilegeRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = pRVar12;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001224aa;
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsImportDatabaseBetweenInstancesRequestType::
    ~RdsImportDatabaseBetweenInstancesRequestType
              ((RdsImportDatabaseBetweenInstancesRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012262a;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00122794;
    aliyun::RdsImportDataFromDatabaseRequestType::~RdsImportDataFromDatabaseRequestType
              ((RdsImportDataFromDatabaseRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00122976;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00122adb;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00122c40;
    aliyun::RdsModifyAccountDescriptionRequestType::~RdsModifyAccountDescriptionRequestType
              ((RdsModifyAccountDescriptionRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00122db9;
    aliyun::RdsModifyBackupPolicyRequestType::~RdsModifyBackupPolicyRequestType
              ((RdsModifyBackupPolicyRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00122f32;
    aliyun::RdsModifyDBDescriptionRequestType::~RdsModifyDBDescriptionRequestType
              ((RdsModifyDBDescriptionRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001230ab;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00123210;
    aliyun::RdsModifyDBInstanceConnectionStringRequestType::
    ~RdsModifyDBInstanceConnectionStringRequestType
              ((RdsModifyDBInstanceConnectionStringRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012339d;
    aliyun::RdsModifyDBInstanceDescriptionRequestType::~RdsModifyDBInstanceDescriptionRequestType
              ((RdsModifyDBInstanceDescriptionRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00123516;
    aliyun::RdsModifyDBInstanceMaintainTimeRequestType::~RdsModifyDBInstanceMaintainTimeRequestType
              ((RdsModifyDBInstanceMaintainTimeRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_0012368f;
    aliyun::RdsModifyDBInstanceNetworkTypeRequestType::~RdsModifyDBInstanceNetworkTypeRequestType
              ((RdsModifyDBInstanceNetworkTypeRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00123830;
    aliyun::RdsModifyDBInstanceSpecRequestType::~RdsModifyDBInstanceSpecRequestType
              ((RdsModifyDBInstanceSpecRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001239d1;
    aliyun::RdsModifyParameterRequestType::~RdsModifyParameterRequestType
              ((RdsModifyParameterRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00123b5e;
    aliyun::RdsModifyPostpaidDBInstanceSpecRequestType::~RdsModifyPostpaidDBInstanceSpecRequestType
              ((RdsModifyPostpaidDBInstanceSpecRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00123ceb;
    aliyun::RdsModifySecurityIpsRequestType::~RdsModifySecurityIpsRequestType
              ((RdsModifySecurityIpsRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = pRVar12;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00123e64;
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsPreCheckBeforeImportDataRequestType::~RdsPreCheckBeforeImportDataRequestType
              ((RdsPreCheckBeforeImportDataRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00124048;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001241ad;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_268 = (string  [8])&local_258;
    local_260._M_p = (pointer)0x0;
    local_258._M_local_buf[0] = '\0';
    local_248 = (string  [8])(local_240 + 8);
    local_240._0_8_ = 0;
    local_240[8] = '\0';
    local_228._0_8_ = &local_218;
    local_228._8_8_ = 0;
    local_218._M_local_buf[0] = '\0';
    local_208._0_8_ = &local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_local_buf[0] = '\0';
    local_1e8._M_p = local_1e0 + 8;
    local_1e0._0_8_ = 0;
    local_1e0[8] = '\0';
    local_1c8._M_p = local_1c0 + 8;
    local_1c0._0_8_ = 0;
    local_1c0[8] = '\0';
    local_1a8._M_p = local_1a0 + 8;
    local_1a0._0_8_ = 0;
    local_1a0[8] = '\0';
    local_188._M_p = local_180 + 8;
    local_180._0_8_ = 0;
    local_180[8] = '\0';
    local_168._M_p = local_158;
    local_160 = (undefined1  [8])0x0;
    local_158[0] = false;
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00124312;
    aliyun::RdsRemoveTagsFromResourceRequestType::~RdsRemoveTagsFromResourceRequestType
              ((RdsRemoveTagsFromResourceRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00124553;
    aliyun::RdsResetAccountForPGRequestType::~RdsResetAccountForPGRequestType
              ((RdsResetAccountForPGRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001246cc;
    aliyun::RdsResetAccountPasswordRequestType::~RdsResetAccountPasswordRequestType
              ((RdsResetAccountPasswordRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00124845;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._0_8_ != &local_2b8) {
      operator_delete((void *)local_2c8._0_8_,
                      CONCAT71(local_2b8._M_allocated_capacity._1_7_,local_2b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ != &local_2d8) {
      operator_delete((void *)local_2e8._0_8_,
                      CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._0_8_ != &local_2f8) {
      operator_delete((void *)local_308._0_8_,
                      CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,
                      CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
      operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
    }
    if ((pointer)local_368._0_8_ != pcVar1) {
      operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
    }
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_001249aa;
    aliyun::RdsRestoreDBInstanceRequestType::~RdsRestoreDBInstanceRequestType
              ((RdsRestoreDBInstanceRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00124b23;
    aliyun::RdsRevokeAccountPrivilegeRequestType::~RdsRevokeAccountPrivilegeRequestType
              ((RdsRevokeAccountPrivilegeRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_e8._8_8_ = (undefined1 *)0x0;
    local_d8[0] = '\0';
    local_c8._M_allocated_capacity = (size_type)&local_b8;
    local_c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_b8 = (char *)((ulong)local_b8 & 0xffffffffffffff00);
    local_408 = 0x676e61682d6e63;
    uStack_401 = 0x7a;
    uStack_400 = 0x68;
    uStack_3ff = 0x756f;
    local_410 = 0xb;
    local_3fd = 0;
    local_3e8 = 0x64697070615f796d;
    local_3f0 = 8;
    local_3e0 = local_3e0 & 0xff00;
    local_380._0_7_ = 0x726365735f796d;
    local_380[7] = 'e';
    local_380[8] = 't';
    local_390._8_8_ = 9;
    local_380[9] = '\0';
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_390._0_8_ = pRVar12;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00124c9c;
    if ((char **)local_c8._M_allocated_capacity != &local_b8) {
      operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8 + 1));
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    aliyun::RdsStartDBInstanceDiagnoseRequestType::~RdsStartDBInstanceDiagnoseRequestType
              ((RdsStartDBInstanceDiagnoseRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00124e1c;
    aliyun::RdsStopSyncingRequestType::~RdsStopSyncingRequestType
              ((RdsStopSyncingRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_2c8._M_allocated_capacity = (size_type)&local_2b8;
    local_2c8._8_8_ = (_Base_ptr)0x0;
    local_2b8._M_local_buf[0] = '\0';
    local_2a8 = (string  [8])&local_298;
    local_2a0._M_p = (pointer)0x0;
    local_298._M_local_buf[0] = '\0';
    local_288 = (string  [8])&local_278;
    local_280._M_p = (pointer)0x0;
    local_278._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3e0 = 0x74;
    local_3f0 = 9;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 != (RdsRemoveTagsFromResourceRequestType *)0x0) goto LAB_00124f95;
    aliyun::RdsSwitchDBInstanceNetTypeRequestType::~RdsSwitchDBInstanceNetTypeRequestType
              ((RdsSwitchDBInstanceNetTypeRequestType *)local_368);
    local_368._8_8_ = (pointer)0x0;
    local_368[0x10] = '\0';
    local_368._32_8_ = local_340 + 8;
    local_340._0_8_ = (pointer)0x0;
    local_340[8] = '\0';
    local_328._0_8_ = &local_318;
    local_328._8_8_ = (pointer)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_8_ = &local_2f8;
    local_308._8_8_ = (pointer)0x0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8._0_8_ = &local_2d8;
    local_2e8._8_8_ = (pointer)0x0;
    local_2d8._M_local_buf[0] = '\0';
    local_d8[0] = 'c';
    local_d8._1_6_ = 0x676e61682d6e;
    local_d8[7] = 'z';
    local_d8[8] = 'h';
    local_d8._9_2_ = 0x756f;
    local_e8._8_8_ = (undefined1 *)0xb;
    local_d8[0xb] = '\0';
    local_408 = 0x697070615f796d;
    uStack_401 = 100;
    local_410 = 8;
    uStack_400 = 0;
    local_3e8 = 0x65726365735f796d;
    local_3f0 = 9;
    local_3e0 = 0x74;
    local_418 = &local_408;
    local_3f8 = &local_3e8;
    local_368._0_8_ = pcVar1;
    local_e8._M_allocated_capacity = (size_type)local_d8;
    this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
    if (local_3f8 != &local_3e8) {
      operator_delete(local_3f8,local_3e8 + 1);
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,
                      CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
    }
    if (this_00 == (RdsRemoveTagsFromResourceRequestType *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._0_8_ != &local_2d8) {
        operator_delete((void *)local_2e8._0_8_,
                        CONCAT71(local_2d8._M_allocated_capacity._1_7_,local_2d8._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._0_8_ != &local_2f8) {
        operator_delete((void *)local_308._0_8_,
                        CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._0_8_ != &local_318) {
        operator_delete((void *)local_328._0_8_,
                        CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_368._32_8_ != local_340 + 8) {
        operator_delete((void *)local_368._32_8_,CONCAT71(local_340._9_7_,local_340[8]) + 1);
      }
      if ((pointer)local_368._0_8_ != pcVar1) {
        operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
      }
      local_368._8_8_ = (pointer)0x0;
      local_368[0x10] = '\0';
      local_368._32_8_ = local_340 + 8;
      local_340._0_8_ = (pointer)0x0;
      local_340[8] = '\0';
      local_328._0_8_ = &local_318;
      local_328._8_8_ = (pointer)0x0;
      local_318._M_local_buf[0] = '\0';
      local_308._0_8_ = &local_2f8;
      local_308._8_8_ = (pointer)0x0;
      local_2f8._M_local_buf[0] = '\0';
      local_2e8._0_8_ = &local_2d8;
      local_2e8._8_8_ = (pointer)0x0;
      local_2d8._M_local_buf[0] = '\0';
      local_2c8._M_allocated_capacity = (size_type)&local_2b8;
      local_2c8._8_8_ = (_Base_ptr)0x0;
      local_2b8._M_local_buf[0] = '\0';
      local_2a8 = (string  [8])&local_298;
      local_2a0._M_p = (pointer)0x0;
      local_298._M_local_buf[0] = '\0';
      local_e8._8_8_ = (undefined1 *)0x0;
      local_d8[0] = '\0';
      local_408 = 0x676e61682d6e63;
      uStack_401 = 0x7a;
      uStack_400 = 0x68;
      uStack_3ff = 0x756f;
      local_410 = 0xb;
      local_3fd = 0;
      local_3e8 = 0x64697070615f796d;
      local_3f0 = 8;
      local_3e0 = local_3e0 & 0xff00;
      local_380._0_7_ = 0x726365735f796d;
      local_380[7] = 'e';
      local_380[8] = 't';
      local_390._8_8_ = 9;
      local_380[9] = '\0';
      local_418 = &local_408;
      local_3f8 = &local_3e8;
      local_390._0_8_ = pRVar12;
      local_368._0_8_ = pcVar1;
      local_e8._M_allocated_capacity = (size_type)local_d8;
      this_00 = (RdsRemoveTagsFromResourceRequestType *)aliyun::Rds::CreateRdsClient();
      if ((pointer)local_390._0_8_ != pRVar12) {
        operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8,local_3e8 + 1);
      }
      if (local_418 != &local_408) {
        operator_delete(local_418,CONCAT17(uStack_401,local_408) + 1);
      }
      if (this_00 == (RdsRemoveTagsFromResourceRequestType *)0x0) {
        if ((undefined1 *)local_e8._M_allocated_capacity != local_d8) {
          operator_delete((void *)local_e8._M_allocated_capacity,
                          CONCAT17(local_d8[7],CONCAT61(local_d8._1_6_,local_d8[0])) + 1);
        }
        aliyun::RdsUpgradeDBInstanceEngineVersionRequestType::
        ~RdsUpgradeDBInstanceEngineVersionRequestType
                  ((RdsUpgradeDBInstanceEngineVersionRequestType *)local_368);
        return 0;
      }
      goto LAB_00125273;
    }
  }
  else {
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"proxyId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceId");
    std::__cxx11::string::operator=(local_2a8,"Tag.1.key");
    std::__cxx11::string::operator=(local_288,"Tag.2.key");
    std::__cxx11::string::operator=(local_268,"Tag.3.key");
    std::__cxx11::string::operator=(local_248,"Tag.4.key");
    std::__cxx11::string::operator=((string *)local_228,"Tag.5.key");
    std::__cxx11::string::operator=((string *)local_208,"Tag.1.value");
    std::__cxx11::string::operator=((string *)&local_1e8,"Tag.2.value");
    std::__cxx11::string::operator=((string *)&local_1c8,"Tag.3.value");
    std::__cxx11::string::operator=((string *)&local_1a8,"Tag.4.value");
    std::__cxx11::string::operator=((string *)&local_188,"Tag.5.value");
    std::__cxx11::string::operator=((string *)&local_168,"OwnerAccount");
    aliyun::Rds::AddTagsToResource
              (this,(RdsAddTagsToResourceResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_1();
LAB_0011b7d4:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"ConnectionStringPrefix");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Port");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::AllocateInstancePrivateConnection
              ((RdsAllocateInstancePrivateConnectionRequestType *)this,
               (RdsAllocateInstancePrivateConnectionResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_2();
LAB_0011b955:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"ConnectionStringPrefix");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Port");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::AllocateInstancePublicConnection
              ((RdsAllocateInstancePublicConnectionRequestType *)this,
               (RdsAllocateInstancePublicConnectionResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_3();
LAB_0011bad6:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBName");
    std::__cxx11::string::operator=(local_2a8,"AccountPrivilege");
    std::__cxx11::string::operator=(local_288,"OwnerAccount");
    aliyun::Rds::BatchGrantAccountPrivilege
              ((RdsBatchGrantAccountPrivilegeRequestType *)this,
               (RdsBatchGrantAccountPrivilegeResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_4();
LAB_0011bc6b:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBName");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::BatchRevokeAccountPrivilege
              ((RdsBatchRevokeAccountPrivilegeRequestType *)this,
               (RdsBatchRevokeAccountPrivilegeResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_5();
LAB_0011bdec:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"ImportId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::CancelImport
              ((RdsCancelImportRequestType *)this,(RdsCancelImportResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_6();
LAB_0011bf59:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"AccountName");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::CheckAccountNameAvailable
              ((RdsCheckAccountNameAvailableRequestType *)this,
               (RdsCheckAccountNameAvailableResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_7();
LAB_0011c0da:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBName");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::CheckDBNameAvailable
              ((RdsCheckDBNameAvailableRequestType *)this,
               (RdsCheckDBNameAvailableResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_8();
LAB_0011c25b:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"AccountPassword");
    std::__cxx11::string::operator=(local_2a8,"AccountDescription");
    std::__cxx11::string::operator=(local_288,"OwnerAccount");
    aliyun::Rds::CreateAccount
              ((RdsCreateAccountRequestType *)this,(RdsCreateAccountResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_9();
LAB_0011c3f0:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"AccountPassword");
    std::__cxx11::string::operator=(local_2a8,"DBName");
    std::__cxx11::string::operator=(local_288,"AccountPrivilege");
    std::__cxx11::string::operator=(local_268,"AccountDescription");
    std::__cxx11::string::operator=(local_248,"OwnerAccount");
    aliyun::Rds::CreateAccountForInner
              ((RdsCreateAccountForInnerRequestType *)this,
               (RdsCreateAccountForInnerResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_10();
LAB_0011c5ad:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"DBName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"BackupMethod");
    std::__cxx11::string::operator=(local_2a8,"BackupType");
    std::__cxx11::string::operator=(local_288,"OwnerAccount");
    aliyun::Rds::CreateBackup
              ((RdsCreateBackupRequestType *)this,(RdsCreateBackupResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_11();
LAB_0011c742:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"DBName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"CharacterSetName");
    std::__cxx11::string::operator=(local_2a8,"DBDescription");
    std::__cxx11::string::operator=(local_288,"OwnerAccount");
    aliyun::Rds::CreateDatabase
              ((RdsCreateDatabaseRequestType *)this,(RdsCreateDatabaseResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_12();
LAB_0011c8d7:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = (HttpTestListener *)local_380;
    aliyun::Rds::SetProxyHost((Rds *)pHVar8,(string *)local_390);
    if ((HttpTestListener *)local_390._0_8_ != (HttpTestListener *)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(pHVar8->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar8->request_url_)._M_string_length + 1) = 0;
    }
    pRVar9 = (RdsCreateDBInstanceRequestType *)operator_new(0x180);
    HttpTestListener::HttpTestListener((HttpTestListener *)pRVar9,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    HttpTestListener::SetResponseBody((HttpTestListener *)pRVar9,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start((HttpTestListener *)pRVar9);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"DBName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"CharacterSetName");
    std::__cxx11::string::operator=(local_2a8,"DBDescription");
    std::__cxx11::string::operator=(local_288,"AccountName");
    std::__cxx11::string::operator=(local_268,"AccountPrivilege");
    std::__cxx11::string::operator=(local_248,"AccountPassword");
    std::__cxx11::string::operator=((string *)local_228,"OwnerAccount");
    aliyun::Rds::CreateDatabaseForInner
              ((RdsCreateDatabaseForInnerRequestType *)pHVar8,
               (RdsCreateDatabaseForInnerResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete((HttpTestListener *)pRVar9);
    main_cold_13();
LAB_0011caaa:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)pRVar9,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)((string *)(local_380._16_8_ + 0x20))->_M_string_length == '\x01') {
      *(undefined1 *)((long)&((string *)(local_380._16_8_ + 0x20))->_M_string_length + 1) = 0;
    }
    pRVar9 = (RdsCreateDBInstanceRequestType *)operator_new(0x180);
    HttpTestListener::HttpTestListener((HttpTestListener *)pRVar9,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceId\": \"DBInstanceId\",  \"OrderId\": \"OrderId\",  \"ConnectionString\": \"ConnectionString\",  \"Port\": \"Port\"}"
               ,"");
    HttpTestListener::SetResponseBody((HttpTestListener *)pRVar9,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start((HttpTestListener *)pRVar9);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"Engine");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EngineVersion");
    std::__cxx11::string::operator=(local_2a8,"DBInstanceClass");
    std::__cxx11::string::operator=(local_288,"DBInstanceStorage");
    std::__cxx11::string::operator=(local_268,"SystemDBCharset");
    std::__cxx11::string::operator=(local_248,"DBInstanceNetType");
    std::__cxx11::string::operator=((string *)local_228,"DBInstanceDescription");
    std::__cxx11::string::operator=((string *)local_208,"SecurityIPList");
    std::__cxx11::string::operator=((string *)&local_1e8,"PayType");
    std::__cxx11::string::operator=((string *)&local_1c8,"ZoneId");
    std::__cxx11::string::operator=((string *)&local_1a8,"InstanceNetworkType");
    std::__cxx11::string::operator=((string *)&local_188,"ConnectionMode");
    std::__cxx11::string::operator=((string *)&local_168,"VPCId");
    std::__cxx11::string::operator=((string *)&local_148,"VSwitchId");
    std::__cxx11::string::operator=((string *)local_128._M_local_buf,"PrivateIpAddress");
    std::__cxx11::string::operator=((string *)local_108._M_local_buf,"OwnerAccount");
    aliyun::Rds::CreateDBInstance
              ((RdsCreateDBInstanceRequestType *)local_380._16_8_,
               (RdsCreateDBInstanceResponseType *)local_368,(RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete((HttpTestListener *)pRVar9);
    main_cold_14();
LAB_0011cd45:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)pRVar9,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)((string *)(local_380._16_8_ + 0x20))->_M_string_length == '\x01') {
      *(undefined1 *)((long)&((string *)(local_380._16_8_ + 0x20))->_M_string_length + 1) = 0;
    }
    pRVar9 = (RdsCreateDBInstanceRequestType *)operator_new(0x180);
    HttpTestListener::HttpTestListener((HttpTestListener *)pRVar9,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceId\": \"DBInstanceId\",  \"OrderId\": \"OrderId\",  \"ConnectionString\": \"ConnectionString\",  \"Port\": \"Port\"}"
               ,"");
    HttpTestListener::SetResponseBody((HttpTestListener *)pRVar9,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start((HttpTestListener *)pRVar9);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"SystemDBCharset");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Engine");
    std::__cxx11::string::operator=(local_2a8,"EngineVersion");
    std::__cxx11::string::operator=(local_288,"DBInstanceClass");
    std::__cxx11::string::operator=(local_268,"DBInstanceStorage");
    std::__cxx11::string::operator=(local_248,"DBInstanceNetType");
    std::__cxx11::string::operator=((string *)local_228,"DBInstanceDescription");
    std::__cxx11::string::operator=((string *)local_208,"SecurityIPList");
    std::__cxx11::string::operator=((string *)&local_1e8,"AccountName");
    std::__cxx11::string::operator=((string *)&local_1c8,"AccountPassword");
    std::__cxx11::string::operator=((string *)&local_1a8,"PayType");
    std::__cxx11::string::operator=((string *)&local_188,"OwnerAccount");
    aliyun::Rds::CreateDBInstanceForChannel
              ((RdsCreateDBInstanceForChannelRequestType *)local_380._16_8_,
               (RdsCreateDBInstanceForChannelResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete((HttpTestListener *)pRVar9);
    main_cold_15();
LAB_0011cf90:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)pRVar9,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)((string *)(local_380._16_8_ + 0x20))->_M_string_length == '\x01') {
      *(undefined1 *)((long)&((string *)(local_380._16_8_ + 0x20))->_M_string_length + 1) = 0;
    }
    pRVar9 = (RdsCreateDBInstanceRequestType *)operator_new(0x180);
    HttpTestListener::HttpTestListener((HttpTestListener *)pRVar9,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceId\": \"DBInstanceId\",  \"ConnectionString\": \"ConnectionString\",  \"Port\": \"Port\"}"
               ,"");
    HttpTestListener::SetResponseBody((HttpTestListener *)pRVar9,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start((HttpTestListener *)pRVar9);
    std::__cxx11::string::operator=((string *)local_368,"uid");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"bid");
    std::__cxx11::string::operator=((string *)local_328,"uidLoginEmail");
    std::__cxx11::string::operator=((string *)local_308,"bidLoginEmail");
    std::__cxx11::string::operator=((string *)local_2e8,"Engine");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EngineVersion");
    std::__cxx11::string::operator=(local_2a8,"DBInstanceClass");
    std::__cxx11::string::operator=(local_288,"DBInstanceStorage");
    std::__cxx11::string::operator=(local_268,"DBInstanceNetType");
    std::__cxx11::string::operator=(local_248,"CharacterSetName");
    std::__cxx11::string::operator=((string *)local_228,"DBInstanceRemarks");
    std::__cxx11::string::operator=((string *)local_208,"ClientToken");
    std::__cxx11::string::operator=((string *)&local_1e8,"OwnerAccount");
    aliyun::Rds::CreateDBInstanceforFirstPay
              ((RdsCreateDBInstanceforFirstPayRequestType *)local_380._16_8_,
               (RdsCreateDBInstanceforFirstPayResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete((HttpTestListener *)pRVar9);
    main_cold_16();
LAB_0011d19f:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)pRVar9,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)((string *)(local_380._16_8_ + 0x20))->_M_string_length == '\x01') {
      *(undefined1 *)((long)&((string *)(local_380._16_8_ + 0x20))->_M_string_length + 1) = 0;
    }
    pRVar9 = (RdsCreateDBInstanceRequestType *)operator_new(0x180);
    HttpTestListener::HttpTestListener((HttpTestListener *)pRVar9,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceId\": \"DBInstanceId\",  \"OrderId\": \"OrderId\",  \"ConnectionString\": \"ConnectionString\",  \"Port\": \"Port\"}"
               ,"");
    HttpTestListener::SetResponseBody((HttpTestListener *)pRVar9,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start((HttpTestListener *)pRVar9);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"Engine");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EngineVersion");
    std::__cxx11::string::operator=(local_2a8,"DBInstanceClass");
    std::__cxx11::string::operator=(local_288,"DBInstanceStorage");
    std::__cxx11::string::operator=(local_268,"DBInstanceNetType");
    std::__cxx11::string::operator=(local_248,"DBInstanceDescription");
    std::__cxx11::string::operator=((string *)local_228,"SecurityIPList");
    std::__cxx11::string::operator=((string *)local_208,"OwnerAccount");
    aliyun::Rds::CreatePostpaidDBInstance
              ((RdsCreatePostpaidDBInstanceRequestType *)local_380._16_8_,
               (RdsCreatePostpaidDBInstanceResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete((HttpTestListener *)pRVar9);
    main_cold_17();
LAB_0011d39a:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)pRVar9,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)((string *)(local_380._16_8_ + 0x20))->_M_string_length == '\x01') {
      *(undefined1 *)((long)&((string *)(local_380._16_8_ + 0x20))->_M_string_length + 1) = 0;
    }
    pRVar9 = (RdsCreateDBInstanceRequestType *)operator_new(0x180);
    HttpTestListener::HttpTestListener((HttpTestListener *)pRVar9,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceId\": \"DBInstanceId\",  \"OrderId\": \"OrderId\",  \"ConnectionString\": \"ConnectionString\",  \"Port\": \"Port\"}"
               ,"");
    HttpTestListener::SetResponseBody((HttpTestListener *)pRVar9,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start((HttpTestListener *)pRVar9);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"Engine");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EngineVersion");
    std::__cxx11::string::operator=(local_2a8,"DBInstanceClass");
    std::__cxx11::string::operator=(local_288,"DBInstanceStorage");
    std::__cxx11::string::operator=(local_268,"DBInstanceNetType");
    std::__cxx11::string::operator=(local_248,"DBInstanceDescription");
    std::__cxx11::string::operator=((string *)local_228,"SecurityIPList");
    std::__cxx11::string::operator=((string *)local_208,"OwnerAccount");
    aliyun::Rds::CreatePostpaidDBInstanceForChannel
              ((RdsCreatePostpaidDBInstanceForChannelRequestType *)local_380._16_8_,
               (RdsCreatePostpaidDBInstanceForChannelResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete((HttpTestListener *)pRVar9);
    main_cold_18();
LAB_0011d595:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)pRVar9,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)((string *)(local_380._16_8_ + 0x20))->_M_string_length == '\x01') {
      *(undefined1 *)((long)&((string *)(local_380._16_8_ + 0x20))->_M_string_length + 1) = 0;
    }
    pHVar11 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar11,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceId\": \"DBInstanceId\",  \"OrderId\": \"OrderId\",  \"ConnectionString\": \"ConnectionString\",  \"Port\": \"Port\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar11,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar11);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"ZoneId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceId");
    std::__cxx11::string::operator=(local_2a8,"DBInstanceClass");
    std::__cxx11::string::operator=(local_288,"DBInstanceStorage");
    std::__cxx11::string::operator=(local_268,"EngineVersion");
    std::__cxx11::string::operator=(local_248,"PayType");
    std::__cxx11::string::operator=((string *)local_228,"DBInstanceDescription");
    std::__cxx11::string::operator=((string *)local_208,"InstanceNetworkType");
    std::__cxx11::string::operator=((string *)&local_1e8,"VPCId");
    std::__cxx11::string::operator=((string *)&local_1c8,"VSwitchId");
    std::__cxx11::string::operator=((string *)&local_1a8,"PrivateIpAddress");
    std::__cxx11::string::operator=((string *)&local_188,"OwnerAccount");
    aliyun::Rds::CreateReadOnlyDBInstance
              ((RdsCreateReadOnlyDBInstanceRequestType *)local_380._16_8_,
               (RdsCreateReadOnlyDBInstanceResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar11);
    main_cold_19();
LAB_0011d7e0:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)pHVar8,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar8->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar8->request_url_)._M_string_length + 1) = 0;
    }
    pHVar11 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar11,0x2fca);
    pRVar12 = (pointer)(local_3b8 + 0x10);
    local_3b8._0_8_ = pRVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,"{  \"TempDBInstanceId\": \"TempDBInstanceId\"}","");
    HttpTestListener::SetResponseBody(pHVar11,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != pRVar12) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar11);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"BackupId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"RestoreTime");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::CreateTempDBInstance
              ((RdsCreateTempDBInstanceRequestType *)pHVar8,
               (RdsCreateTempDBInstanceResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar11);
    main_cold_20();
LAB_0011d962:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar10->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar10->request_url_)._M_string_length + 1) = 0;
    }
    this_00 = (RdsRemoveTagsFromResourceRequestType *)operator_new(0x180);
    HttpTestListener::HttpTestListener((HttpTestListener *)this_00,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"InternetFtpServer\": \"InternetFtpServer\",  \"InternetPort\": 0,  \"IntranetFtpserver\": \"IntranetFtpserver\",  \"Intranetport\": 0,  \"UserName\": \"UserName\",  \"Password\": \"Password\",  \"FileName\": \"FileName\"}"
               ,"");
    HttpTestListener::SetResponseBody((HttpTestListener *)this_00,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start((HttpTestListener *)this_00);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    pRVar12 = (pointer)((long)&(((string *)&pHVar8->is_request_complete_)->_M_dataplus)._M_p +
                       (long)&(((string *)&pRVar12->read_only_db_instance_ids)->_M_dataplus)._M_p);
    std::__cxx11::string::operator=((string *)pRVar12,"DBName");
    std::__cxx11::string::operator=((string *)&pHVar8->map_request_query_,"OwnerAccount");
    aliyun::Rds::CreateUploadPathForSQLServer
              ((RdsCreateUploadPathForSQLServerRequestType *)pHVar10,
               (RdsCreateUploadPathForSQLServerResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete((HttpTestListener *)this_00);
    main_cold_21();
LAB_0011dad4:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::DeleteAccount
              ((RdsDeleteAccountRequestType *)this_00,(RdsDeleteAccountResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_22();
LAB_0011dc39:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"DBName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::DeleteDatabase
              ((RdsDeleteDatabaseRequestType *)this_00,(RdsDeleteDatabaseResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_23();
LAB_0011dd9e:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::DeleteDBInstance
              ((RdsDeleteDBInstanceRequestType *)this_00,
               (RdsDeleteDBInstanceResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_24();
LAB_0011df03:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"ImportResultFromDB\": [      {        \"ImportId\": 0,        \"ImportDataType\": \"ImportDataType\",        \"ImportDataStatus\": \"ImportDataStatus\",        \"ImportDataStatusDescription\": \"ImportDataStatusDescription\",        \"IncrementalImportingTime\": \"IncrementalImportingTime\"      }    ]  },  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Engine");
    std::__cxx11::string::operator=(local_2a8,"ImportId");
    std::__cxx11::string::operator=(local_288,"StartTime");
    std::__cxx11::string::operator=(local_268,"EndTime");
    std::__cxx11::string::operator=(local_248,"PageSize");
    std::__cxx11::string::operator=((string *)local_228,"PageNumber");
    std::__cxx11::string::operator=((string *)local_208,"OwnerAccount");
    aliyun::Rds::DescibeImportsFromDatabase
              ((RdsDescibeImportsFromDatabaseRequestType *)this_00,
               (RdsDescibeImportsFromDatabaseResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_25();
LAB_0011e0e7:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3b8 + 0x10);
    local_3b8._0_8_ = pRVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"InstanceResult\": [      {        \"AbnormalItems\": {          \"AbnormalItem\": [            {              \"AdviseValue\": {                \"String\": [                  \"String\"                ]              },              \"CheckTime\": \"CheckTime\",              \"CheckItem\": \"CheckItem\",              \"AbnormalReason\": \"AbnormalReason\",              \"AbnormalValue\": \"AbnormalValue\",              \"AbnormalDetail\": \"AbnormalDetail\",              \"AdviceKey\": \"AdviceKey\"            }          ]        },        \"DBInstanceDescription\": \"DBInstanceDescription\",        \"DBInstanceId\": \"DBInstanceId\"      }    ]  },  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != pRVar12) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"proxyId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceId");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeAbnormalDBInstances
              ((RdsDescribeAbnormalDBInstancesRequestType *)this_00,
               (RdsDescribeAbnormalDBInstancesResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_26();
LAB_0011e28f:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._0_8_ = local_3d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,
               "{  \"Accounts\": {    \"DBInstanceAccount\": [      {        \"DatabasePrivileges\": {          \"DatabasePrivilege\": [            {              \"DBName\": \"DBName\",              \"AccountPrivilege\": \"AccountPrivilege\"            }          ]        },        \"DBInstanceId\": \"DBInstanceId\",        \"AccountName\": \"AccountName\",        \"AccountStatus\": \"AccountStatus\",        \"AccountDescription\": \"AccountDescription\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::DescribeAccounts
              ((RdsDescribeAccountsRequestType *)this_00,
               (RdsDescribeAccountsResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_27();
LAB_0011e3f9:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"BackupRetentionPeriod\": 0,  \"PreferredNextBackupTime\": \"PreferredNextBackupTime\",  \"PreferredBackupTime\": \"PreferredBackupTime\",  \"PreferredBackupPeriod\": \"PreferredBackupPeriod\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"OwnerAccount");
    aliyun::Rds::DescribeBackupPolicy
              ((RdsDescribeBackupPolicyRequestType *)this_00,
               (RdsDescribeBackupPolicyResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_28();
LAB_0011e551:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"Backup\": [      {        \"BackupId\": \"BackupId\",        \"DBInstanceId\": \"DBInstanceId\",        \"BackupStatus\": \"BackupStatus\",        \"BackupStartTime\": \"BackupStartTime\",        \"BackupEndTime\": \"BackupEndTime\",        \"BackupType\": \"BackupType\",        \"BackupMode\": \"BackupMode\",        \"BackupMethod\": \"BackupMethod\",        \"BackupDownloadURL\": \"BackupDownloadURL\",        \"BackupLocation\": \"BackupLocation\",        \"BackupExtractionStatus\": \"BackupExtractionStatus\",        \"BackupScale\": \"BackupScale\",        \"BackupDBNames\": \"BackupDBNames\",        \"BackupSize\": 0      }    ]  },  \"TotalRecordCount\": \"TotalRecordCount\",  \"PageNumber\": \"PageNumber\",  \"PageRecordCount\": \"PageRecordCount\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"BackupId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"BackupLocation");
    std::__cxx11::string::operator=(local_2a8,"BackupStatus");
    std::__cxx11::string::operator=(local_288,"BackupMode");
    std::__cxx11::string::operator=(local_268,"StartTime");
    std::__cxx11::string::operator=(local_248,"EndTime");
    std::__cxx11::string::operator=((string *)local_228,"PageSize");
    std::__cxx11::string::operator=((string *)local_208,"PageNumber");
    std::__cxx11::string::operator=((string *)&local_1e8,"OwnerAccount");
    aliyun::Rds::DescribeBackups
              ((RdsDescribeBackupsRequestType *)this_00,(RdsDescribeBackupsResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_29();
LAB_0011e749:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._0_8_ = local_3d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,
               "{  \"Items\": {    \"BackupJob\": [      {        \"BackupProgressStatus\": \"BackupProgressStatus\",        \"JobMode\": \"JobMode\",        \"Process\": \"Process\",        \"TaskAction\": \"TaskAction\",        \"BackupjobId\": \"BackupjobId\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"Flag");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    std::__cxx11::string::operator=(local_2a8,"DBInstanceId");
    std::__cxx11::string::operator=(local_288,"BackupJobId");
    std::__cxx11::string::operator=(local_268,"BackupMode");
    std::__cxx11::string::operator=(local_248,"BackupJobStatus");
    aliyun::Rds::DescribeBackupTasks
              ((RdsDescribeBackupTasksRequestType *)this_00,
               (RdsDescribeBackupTasksResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_30();
LAB_0011e90b:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"BinLogFile\": [      {        \"FileSize\": 0,        \"LogBeginTime\": \"LogBeginTime\",        \"LogEndTime\": \"LogEndTime\",        \"DownloadLink\": \"DownloadLink\",        \"LinkExpiredTime\": \"LinkExpiredTime\"      }    ]  },  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"StartTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EndTime");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeBinlogFiles
              ((RdsDescribeBinlogFilesRequestType *)this_00,
               (RdsDescribeBinlogFilesResponseType *)local_368,(RdsErrorInfo *)local_e8._M_local_buf
              );
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_31();
LAB_0011eab3:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,
               "{  \"Databases\": {    \"Database\": [      {        \"Accounts\": {          \"AccountPrivilegeInfo\": [            {              \"Account\": \"Account\",              \"AccountPrivilege\": \"AccountPrivilege\"            }          ]        },        \"DBName\": \"DBName\",        \"DBInstanceId\": \"DBInstanceId\",        \"Engine\": \"Engine\",        \"DBStatus\": \"DBStatus\",        \"CharacterSetName\": \"CharacterSetName\",        \"DBDescription\": \"DBDescription\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"DBName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBStatus");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeDatabases
              ((RdsDescribeDatabasesRequestType *)this_00,
               (RdsDescribeDatabasesResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_32();
LAB_0011ec39:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,
               "{  \"Items\": {    \"DBInstanceAttribute\": [      {        \"ReadOnlyDBInstanceIds\": {          \"ReadOnlyDBInstanceId\": [            {              \"DBInstanceId\": \"DBInstanceId\"            }          ]        },        \"InsId\": 0,        \"DBInstanceId\": \"DBInstanceId\",        \"PayType\": \"PayType\",        \"DBInstanceClassType\": \"DBInstanceClassType\",        \"DBInstanceType\": \"DBInstanceType\",        \"RegionId\": \"RegionId\",        \"ConnectionString\": \"ConnectionString\",        \"Port\": \"Port\",        \"Engine\": \"Engine\",        \"EngineVersion\": \"EngineVersion\",        \"DBInstanceClass\": \"DBInstanceClass\",        \"DBInstanceMemory\": 0,        \"DBInstanceStorage\": 0,        \"DBInstanceNetType\": \"DBInstanceNetType\",        \"DBInstanceStatus\": \"DBInstanceStatus\",        \"DBInstanceDescription\": \"DBInstanceDescription\",        \"LockMode\": \"LockMode\",        \"LockReason\": \"LockReason\",        \"ReadDelayTime\": \"ReadDelayTime\",        \"DBMaxQuantity\": 0,        \"AccountMaxQuantity\": 0,        \"CreationTime\": \"CreationTime\",        \"ExpireTime\": \"ExpireTime\",        \"MaintainTime\": \"MaintainTime\",        \"AvailabilityValue\": \"AvailabilityValue\",        \"MaxIOPS\": 0,        \"MaxConnections\": 0,        \"MasterInstanceId\": \"MasterInstanceId\",        \"IncrementSourceDBInstanceId\": \"IncrementSourceDBInstanceId\",        \"GuardDBInstanceId\": \"GuardDBInstanceId\",        \"TempDBInstanceId\": \"TempDBInstanceId\",        \"SecurityIPList\": \"SecurityIPList\",        \"ZoneId\": \"ZoneId\",        \"InstanceNetworkType\": \"InstanceNetworkType\",        \"VpcId\": \"VpcId\",        \"ConnectionMode\": \"ConnectionMode\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::DescribeDBInstanceAttribute
              ((RdsDescribeDBInstanceAttributeRequestType *)this_00,
               (RdsDescribeDBInstanceAttributeResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_33();
LAB_0011edab:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = local_380;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._0_8_ = local_3d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,
               "{  \"Items\": {    \"DBInstanceIPArray\": [      {        \"DBInstanceIPArrayName\": \"DBInstanceIPArrayName\",        \"DBInstanceIPArrayAttribute\": \"DBInstanceIPArrayAttribute\",        \"SecurityIPList\": \"SecurityIPList\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"OwnerAccount");
    aliyun::Rds::DescribeDBInstanceIPArrayList
              ((RdsDescribeDBInstanceIPArrayListRequestType *)this_00,
               (RdsDescribeDBInstanceIPArrayListResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_34();
LAB_0011ef09:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceNetInfos\": {    \"DBInstanceNetInfo\": [      {        \"SecurityIPGroups\": {          \"securityIPGroups\": [            {              \"SecurityIPGroupName\": \"SecurityIPGroupName\",              \"SecurityIPs\": \"SecurityIPs\"            }          ]        },        \"ConnectionString\": \"ConnectionString\",        \"IPAddress\": \"IPAddress\",        \"IPType\": \"IPType\",        \"Port\": \"Port\",        \"VPCId\": \"VPCId\",        \"VSwitchId\": \"VSwitchId\"      }    ]  },  \"InstanceNetworkType\": \"InstanceNetworkType\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Flag");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeDBInstanceNetInfo
              ((RdsDescribeDBInstanceNetInfoRequestType *)this_00,
               (RdsDescribeDBInstanceNetInfoResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_35();
LAB_0011f089:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceNetInfos\": {    \"DBInstanceNetInfo\": [      {        \"SecurityIPGroups\": {          \"securityIPGroups\": [            {              \"SecurityIPGroupName\": \"SecurityIPGroupName\",              \"SecurityIPs\": \"SecurityIPs\"            }          ]        },        \"ConnectionString\": \"ConnectionString\",        \"IPAddress\": \"IPAddress\",        \"IPType\": \"IPType\",        \"Port\": \"Port\",        \"VPCId\": \"VPCId\",        \"VSwitchId\": \"VSwitchId\"      }    ]  },  \"InstanceNetworkType\": \"InstanceNetworkType\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Flag");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeDBInstanceNetInfoForChannel
              ((RdsDescribeDBInstanceNetInfoForChannelRequestType *)this_00,
               (RdsDescribeDBInstanceNetInfoForChannelResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_36();
LAB_0011f209:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"PerformanceKeys\": {    \"PerformanceKey\": [      {        \"Values\": {          \"PerformanceValue\": [            {              \"Value\": \"Value\",              \"Date\": \"Date\"            }          ]        },        \"Key\": \"Key\",        \"Unit\": \"Unit\",        \"ValueFormat\": \"ValueFormat\"      }    ]  },  \"DBInstanceId\": \"DBInstanceId\",  \"Engine\": \"Engine\",  \"StartTime\": \"StartTime\",  \"EndTime\": \"EndTime\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Key");
    std::__cxx11::string::operator=(local_2a8,"StartTime");
    std::__cxx11::string::operator=(local_288,"EndTime");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeDBInstancePerformance
              ((RdsDescribeDBInstancePerformanceRequestType *)this_00,
               (RdsDescribeDBInstancePerformanceResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_37();
LAB_0011f3b1:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"DBInstance\": [      {        \"ReadOnlyDBInstanceIds\": {          \"ReadOnlyDBInstanceId\": [            {              \"DBInstanceId\": \"DBInstanceId\"            }          ]        },        \"InsId\": 0,        \"DBInstanceId\": \"DBInstanceId\",        \"DBInstanceDescription\": \"DBInstanceDescription\",        \"PayType\": \"PayType\",        \"DBInstanceType\": \"DBInstanceType\",        \"RegionId\": \"RegionId\",        \"ExpireTime\": \"ExpireTime\",        \"DBInstanceStatus\": \"DBInstanceStatus\",        \"Engine\": \"Engine\",        \"DBInstanceNetType\": \"DBInstanceNetType\",        \"ConnectionMode\": \"ConnectionMode\",        \"LockMode\": \"LockMode\",        \"InstanceNetworkType\": \"InstanceNetworkType\",        \"LockReason\": \"LockReason\",        \"ZoneId\": \"ZoneId\",        \"MutriORsignle\": true,        \"CreateTime\": \"CreateTime\",        \"EngineVersion\": \"EngineVersion\",        \"GuardDBInstanceId\": \"GuardDBInstanceId\",        \"TempDBInstanceId\": \"TempDBInstanceId\",        \"MasterInstanceId\": \"MasterInstanceId\",        \"VpcId\": \"VpcId\"      }    ]  },  \"PageNumber\": 0,  \"TotalRecordCount\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"proxyId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Engine");
    std::__cxx11::string::operator=(local_2a8,"DBInstanceStatus");
    std::__cxx11::string::operator=(local_288,"SearchKey");
    std::__cxx11::string::operator=(local_268,"DBInstanceId");
    std::__cxx11::string::operator=(local_248,"DBInstanceType");
    std::__cxx11::string::operator=((string *)local_228,"PageSize");
    std::__cxx11::string::operator=((string *)local_208,"PageNumber");
    std::__cxx11::string::operator=((string *)&local_1e8,"InstanceNetworkType");
    std::__cxx11::string::operator=((string *)&local_1c8,"ConnectionMode");
    std::__cxx11::string::operator=((string *)&local_1a8,"OwnerAccount");
    aliyun::Rds::DescribeDBInstances
              ((RdsDescribeDBInstancesRequestType *)this_00,
               (RdsDescribeDBInstancesResponseType *)local_368,(RdsErrorInfo *)local_e8._M_local_buf
              );
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_38();
LAB_0011f5d1:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"DBInstanceExpireTime\": [      {        \"DBInstanceId\": \"DBInstanceId\",        \"DBInstanceDescription\": \"DBInstanceDescription\",        \"ExpireTime\": \"ExpireTime\"      }    ]  },  \"PageNumber\": 0,  \"TotalRecordCount\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"proxyId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"ExpirePeriod");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeDBInstancesByExpireTime
              ((RdsDescribeDBInstancesByExpireTimeRequestType *)this_00,
               (RdsDescribeDBInstancesByExpireTimeResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_39();
LAB_0011f779:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"DBInstancePerformance\": [      {        \"CPUUsage\": \"CPUUsage\",        \"IOPSUsage\": \"IOPSUsage\",        \"DiskUsage\": \"DiskUsage\",        \"SessionUsage\": \"SessionUsage\",        \"DBInstanceId\": \"DBInstanceId\",        \"DBInstanceDescription\": \"DBInstanceDescription\"      }    ]  },  \"PageNumber\": 0,  \"TotalRecordCount\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"proxyId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceId");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"SortMethod");
    std::__cxx11::string::operator=(local_248,"SortKey");
    std::__cxx11::string::operator=((string *)local_228,"OwnerAccount");
    aliyun::Rds::DescribeDBInstancesByPerformance
              ((RdsDescribeDBInstancesByPerformanceRequestType *)this_00,
               (RdsDescribeDBInstancesByPerformanceResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_40();
LAB_0011f949:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"ErrorLog\": [      {        \"ErrorInfo\": \"ErrorInfo\",        \"CreateTime\": \"CreateTime\"      }    ]  },  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"StartTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EndTime");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeErrorLogs
              ((RdsDescribeErrorLogsRequestType *)this_00,
               (RdsDescribeErrorLogsResponseType *)local_368,(RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_41();
LAB_0011faf1:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"SQLServerUploadFile\": [      {        \"DBName\": \"DBName\",        \"FileName\": \"FileName\",        \"FileSize\": 0,        \"InternetFtpServer\": \"InternetFtpServer\",        \"InternetPort\": 0,        \"IntranetFtpserver\": \"IntranetFtpserver\",        \"Intranetport\": 0,        \"UserName\": \"UserName\",        \"Password\": \"Password\",        \"FileStatus\": \"FileStatus\",        \"Description\": \"Description\",        \"CreationTime\": \"CreationTime\"      }    ]  },  \"DBInstanceId\": \"DBInstanceId\",  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"StartTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EndTime");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeFilesForSQLServer
              ((RdsDescribeFilesForSQLServerRequestType *)this_00,
               (RdsDescribeFilesForSQLServerResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_42();
LAB_0011fc99:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"SQLServerImport\": [      {        \"ImportId\": 0,        \"FileName\": \"FileName\",        \"DBName\": \"DBName\",        \"ImportStatus\": \"ImportStatus\",        \"StartTime\": \"StartTime\"      }    ]  },  \"TotalRecordCounts\": 0,  \"PageNumber\": 0,  \"SQLItemsCounts\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"ImportId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"StartTime");
    std::__cxx11::string::operator=(local_2a8,"EndTime");
    std::__cxx11::string::operator=(local_288,"PageSize");
    std::__cxx11::string::operator=(local_268,"PageNumber");
    std::__cxx11::string::operator=(local_248,"OwnerAccount");
    aliyun::Rds::DescribeImportsForSQLServer
              ((RdsDescribeImportsForSQLServerRequestType *)this_00,
               (RdsDescribeImportsForSQLServerResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_43();
LAB_0011fe55:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"ParameterChangeLog\": [      {        \"ModifyTime\": \"ModifyTime\",        \"OldParameterValue\": \"OldParameterValue\",        \"NewParameterValue\": \"NewParameterValue\",        \"ParameterName\": \"ParameterName\",        \"Status\": \"Status\"      }    ]  },  \"Engine\": \"Engine\",  \"DBInstanceId\": \"DBInstanceId\",  \"EngineVersion\": \"EngineVersion\",  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"StartTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EndTime");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeModifyParameterLog
              ((RdsDescribeModifyParameterLogRequestType *)this_00,
               (RdsDescribeModifyParameterLogResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_44();
LAB_0011fffd:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"Operationlog\": [      {        \"DBInstanceDescription\": \"DBInstanceDescription\",        \"DBInstanceId\": \"DBInstanceId\",        \"OperationSource\": \"OperationSource\",        \"OperationItem\": \"OperationItem\",        \"executionTime\": \"executionTime\"      }    ]  },  \"Engine\": \"Engine\",  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"SearchKey");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceUseType");
    std::__cxx11::string::operator=(local_2a8,"StartTime");
    std::__cxx11::string::operator=(local_288,"EndTime");
    std::__cxx11::string::operator=(local_268,"PageSize");
    std::__cxx11::string::operator=(local_248,"PageNumber");
    std::__cxx11::string::operator=((string *)local_228,"OwnerAccount");
    aliyun::Rds::DescribeOperationLogs
              ((RdsDescribeOperationLogsRequestType *)this_00,
               (RdsDescribeOperationLogsResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_45();
LAB_001201cd:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"AdviceByDBA\": [      {        \"OptimizationText\": \"OptimizationText\"      }    ]  },  \"TotalRecordsCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"PageSize");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"PageNumber");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeOptimizeAdviceByDBA
              ((RdsDescribeOptimizeAdviceByDBARequestType *)this_00,
               (RdsDescribeOptimizeAdviceByDBAResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_46();
LAB_0012034d:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"AdviceOnBigTable\": [      {        \"DBName\": \"DBName\",        \"TableName\": \"TableName\",        \"TableSize\": 0,        \"DataSize\": 0,        \"IndexSize\": 0      }    ]  },  \"TotalRecordsCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"PageSize");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"PageNumber");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeOptimizeAdviceOnBigTable
              ((RdsDescribeOptimizeAdviceOnBigTableRequestType *)this_00,
               (RdsDescribeOptimizeAdviceOnBigTableResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_47();
LAB_001204cd:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"AdviceOnExcessIndex\": [      {        \"DBName\": \"DBName\",        \"TableName\": \"TableName\",        \"IndexCount\": 0      }    ]  },  \"TotalRecordsCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"PageSize");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"PageNumber");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeOptimizeAdviceOnExcessIndex
              ((RdsDescribeOptimizeAdviceOnExcessIndexRequestType *)this_00,
               (RdsDescribeOptimizeAdviceOnExcessIndexResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_48();
LAB_0012064d:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"AdviceOnMissIndex\": [      {        \"DBName\": \"DBName\",        \"TableName\": \"TableName\",        \"QueryColumn\": \"QueryColumn\",        \"SQLText\": \"SQLText\"      }    ]  },  \"DBInstanceId\": \"DBInstanceId\",  \"TotalRecordsCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"PageSize");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"PageNumber");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeOptimizeAdviceOnMissIndex
              ((RdsDescribeOptimizeAdviceOnMissIndexRequestType *)this_00,
               (RdsDescribeOptimizeAdviceOnMissIndexResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_49();
LAB_001207cd:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"AdviceOnMissPK\": [      {        \"DBName\": \"DBName\",        \"TableName\": \"TableName\"      }    ]  },  \"TotalRecordsCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"PageSize");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"PageNumber");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeOptimizeAdviceOnMissPK
              ((RdsDescribeOptimizeAdviceOnMissPKRequestType *)this_00,
               (RdsDescribeOptimizeAdviceOnMissPKResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_50();
LAB_0012094d:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"AdviceOnStorage\": [      {        \"DBName\": \"DBName\",        \"TableName\": \"TableName\",        \"CurrentEngine\": \"CurrentEngine\",        \"AdviseEngine\": \"AdviseEngine\"      }    ]  },  \"DBInstanceId\": \"DBInstanceId\",  \"TotalRecordsCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"PageSize");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"PageNumber");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeOptimizeAdviceOnStorage
              ((RdsDescribeOptimizeAdviceOnStorageRequestType *)this_00,
               (RdsDescribeOptimizeAdviceOnStorageResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_51();
LAB_00120acd:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"ConfigParameters\": {    \"DBInstanceParameter\": [      {        \"ParameterName\": \"ParameterName\",        \"ParameterValue\": \"ParameterValue\",        \"ParameterDescription\": \"ParameterDescription\"      }    ]  },  \"RunningParameters\": {    \"DBInstanceParameter\": [      {        \"ParameterName\": \"ParameterName\",        \"ParameterValue\": \"ParameterValue\",        \"ParameterDescription\": \"ParameterDescription\"      }    ]  },  \"Engine\": \"Engine\",  \"EngineVersion\": \"EngineVersion\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::DescribeParameters
              ((RdsDescribeParametersRequestType *)this_00,
               (RdsDescribeParametersResponseType *)local_368,(RdsErrorInfo *)local_e8._M_local_buf)
    ;
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_52();
LAB_00120c39:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Parameters\": {    \"TemplateRecord\": [      {        \"ParameterName\": \"ParameterName\",        \"ParameterValue\": \"ParameterValue\",        \"ForceModify\": \"ForceModify\",        \"ForceRestart\": \"ForceRestart\",        \"CheckingCode\": \"CheckingCode\",        \"ParameterDescription\": \"ParameterDescription\"      }    ]  },  \"Engine\": \"Engine\",  \"EngineVersion\": \"EngineVersion\",  \"ParameterCount\": \"ParameterCount\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"Engine");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EngineVersion");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribeParameterTemplates
              ((RdsDescribeParameterTemplatesRequestType *)this_00,
               (RdsDescribeParameterTemplatesResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_53();
LAB_00120db9:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"PreCheckResult\": [      {        \"PreCheckName\": \"PreCheckName\",        \"PreCheckResult\": \"PreCheckResult\",        \"FailReasion\": \"FailReasion\",        \"RepairMethod\": \"RepairMethod\"      }    ]  },  \"DBInstanceId\": \"DBInstanceId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"PreCheckId");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::DescribePreCheckResults
              ((RdsDescribePreCheckResultsRequestType *)this_00,
               (RdsDescribePreCheckResultsResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_54();
LAB_00120f39:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Tasks\": {    \"RealtimeDiagnoseTasks\": [      {        \"CreateTime\": \"CreateTime\",        \"TaskId\": \"TaskId\",        \"HealthScore\": \"HealthScore\",        \"Status\": \"Status\"      }    ]  },  \"Engine\": \"Engine\",  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"StartTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EndTime");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeRealtimeDiagnoses
              ((RdsDescribeRealtimeDiagnosesRequestType *)this_00,
               (RdsDescribeRealtimeDiagnosesResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_55();
LAB_001210e1:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = (pointer)local_380;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != (pointer)local_380) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._0_8_ = local_3d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,
               "{  \"Regions\": {    \"RDSRegion\": [      {        \"RegionId\": \"RegionId\",        \"ZoneId\": \"ZoneId\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"OwnerAccount");
    aliyun::Rds::DescribeRegions
              ((RdsDescribeRegionsRequestType *)this_00,(RdsDescribeRegionsResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_56();
LAB_0012123f:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceId\": \"DBInstanceId\",  \"Engine\": \"Engine\",  \"DiskUsed\": 0,  \"DataSize\": 0,  \"LogSize\": 0,  \"BackupSize\": 0,  \"SQLSize\": 0,  \"ColdBackupSize\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::DescribeResourceUsage
              ((RdsDescribeResourceUsageRequestType *)this_00,
               (RdsDescribeResourceUsageResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_57();
LAB_001213ab:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"SQLSlowRecord\": [      {        \"HostAddress\": \"HostAddress\",        \"DBName\": \"DBName\",        \"SQLText\": \"SQLText\",        \"QueryTimes\": 0,        \"LockTimes\": 0,        \"ParseRowCounts\": 0,        \"ReturnRowCounts\": 0,        \"ExecutionStartTime\": \"ExecutionStartTime\"      }    ]  },  \"Engine\": \"Engine\",  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"SQLId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"StartTime");
    std::__cxx11::string::operator=(local_2a8,"EndTime");
    std::__cxx11::string::operator=(local_288,"DBName");
    std::__cxx11::string::operator=(local_268,"PageSize");
    std::__cxx11::string::operator=(local_248,"PageNumber");
    std::__cxx11::string::operator=((string *)local_228,"OwnerAccount");
    aliyun::Rds::DescribeSlowLogRecords
              ((RdsDescribeSlowLogRecordsRequestType *)this_00,
               (RdsDescribeSlowLogRecordsResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_58();
LAB_0012157b:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"SQLSlowLog\": [      {        \"SlowLogId\": 0,        \"SQLId\": 0,        \"DBName\": \"DBName\",        \"SQLText\": \"SQLText\",        \"MySQLTotalExecutionCounts\": 0,        \"MySQLTotalExecutionTimes\": 0,        \"TotalLockTimes\": 0,        \"MaxLockTime\": 0,        \"ParseTotalRowCounts\": 0,        \"ParseMaxRowCount\": 0,        \"ReturnTotalRowCounts\": 0,        \"ReturnMaxRowCount\": 0,        \"CreateTime\": \"CreateTime\",        \"SQLServerTotalExecutionCounts\": 0,        \"SQLServerTotalExecutionTimes\": 0,        \"TotalLogicalReadCounts\": 0,        \"TotalPhysicalReadCounts\": 0,        \"ReportTime\": \"ReportTime\",        \"MaxExecutionTime\": 0,        \"AvgExecutionTime\": 0      }    ]  },  \"Engine\": \"Engine\",  \"StartTime\": \"StartTime\",  \"EndTime\": \"EndTime\",  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"StartTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EndTime");
    std::__cxx11::string::operator=(local_2a8,"DBName");
    std::__cxx11::string::operator=(local_288,"SortKey");
    std::__cxx11::string::operator=(local_268,"PageSize");
    std::__cxx11::string::operator=(local_248,"PageNumber");
    std::__cxx11::string::operator=((string *)local_228,"OwnerAccount");
    aliyun::Rds::DescribeSlowLogs
              ((RdsDescribeSlowLogsRequestType *)this_00,
               (RdsDescribeSlowLogsResponseType *)local_368,(RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_59();
LAB_0012174b:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"SQLInjectionInfo\": [      {        \"DBName\": \"DBName\",        \"SQLText\": \"SQLText\",        \"LatencyTime\": \"LatencyTime\",        \"HostAddress\": \"HostAddress\",        \"ExecuteTime\": \"ExecuteTime\",        \"AccountName\": \"AccountName\",        \"EffectRowCount\": \"EffectRowCount\"      }    ]  },  \"Engine\": \"Engine\",  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"StartTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EndTime");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeSQLInjectionInfos
              ((RdsDescribeSQLInjectionInfosRequestType *)this_00,
               (RdsDescribeSQLInjectionInfosResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_60();
LAB_001218f3:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"SQLRecord\": [      {        \"DBName\": \"DBName\",        \"AccountName\": \"AccountName\",        \"HostAddress\": \"HostAddress\",        \"SQLText\": \"SQLText\",        \"TotalExecutionTimes\": 0,        \"ReturnRowCounts\": 0,        \"ExecuteTime\": \"ExecuteTime\"      }    ]  },  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"SQLId");
    std::__cxx11::string::operator=(local_2a8,"QueryKeywords");
    std::__cxx11::string::operator=(local_288,"StartTime");
    std::__cxx11::string::operator=(local_268,"EndTime");
    std::__cxx11::string::operator=(local_248,"PageSize");
    std::__cxx11::string::operator=((string *)local_228,"PageNumber");
    std::__cxx11::string::operator=((string *)local_208,"OwnerAccount");
    aliyun::Rds::DescribeSQLLogRecords
              ((RdsDescribeSQLLogRecordsRequestType *)this_00,
               (RdsDescribeSQLLogRecordsResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_61();
LAB_00121ad7:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"Item\": [      {        \"LatencyTopNItems\": {          \"LatencyTopNItem\": [            {              \"SQLText\": \"SQLText\",              \"AvgLatency\": 0,              \"SQLExecuteTimes\": 0            }          ]        },        \"QPSTopNItems\": {          \"QPSTopNItem\": [            {              \"SQLText\": \"SQLText\",              \"SQLExecuteTimes\": 0            }          ]        },        \"ReportTime\": \"ReportTime\"      }    ]  },  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"StartTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EndTime");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::DescribeSQLLogReportList
              ((RdsDescribeSQLLogReportListRequestType *)this_00,
               (RdsDescribeSQLLogReportListResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_62();
LAB_00121c7f:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"SQLReport\": [      {        \"SQLText\": \"SQLText\",        \"TotalExecutionCounts\": \"TotalExecutionCounts\",        \"ReturnTotalRowCounts\": \"ReturnTotalRowCounts\",        \"TotalExecutionTimes\": \"TotalExecutionTimes\"      }    ]  },  \"TotalRecordCount\": \"TotalRecordCount\",  \"PageNumber\": \"PageNumber\",  \"PageRecordCount\": \"PageRecordCount\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"StartTime");
    std::__cxx11::string::operator=(local_2a8,"EndTime");
    std::__cxx11::string::operator=(local_288,"ReportType");
    std::__cxx11::string::operator=(local_268,"PageSize");
    std::__cxx11::string::operator=(local_248,"PageNumber");
    std::__cxx11::string::operator=((string *)local_228,"OwnerAccount");
    aliyun::Rds::DescribeSQLLogReports
              ((RdsDescribeSQLLogReportsRequestType *)this_00,
               (RdsDescribeSQLLogReportsResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_63();
LAB_00121e4f:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3b8 + 0x10);
    local_3b8._0_8_ = pRVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"Items\": {    \"TaskProgressInfo\": [      {        \"DBName\": \"DBName\",        \"BeginTime\": \"BeginTime\",        \"ProgressInfo\": \"ProgressInfo\",        \"FinishTime\": \"FinishTime\",        \"TaskAction\": \"TaskAction\",        \"TaskId\": \"TaskId\",        \"Progress\": \"Progress\",        \"ExpectedFinishTime\": \"ExpectedFinishTime\",        \"Status\": \"Status\",        \"TaskErrorCode\": \"TaskErrorCode\",        \"TaskErrorMessage\": \"TaskErrorMessage\"      }    ]  },  \"TotalRecordCount\": 0,  \"PageNumber\": 0,  \"PageRecordCount\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != pRVar12) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"StartTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EndTime");
    std::__cxx11::string::operator=(local_2a8,"PageSize");
    std::__cxx11::string::operator=(local_288,"PageNumber");
    std::__cxx11::string::operator=(local_268,"Status");
    std::__cxx11::string::operator=(local_248,"TaskAction");
    std::__cxx11::string::operator=((string *)local_228,"OwnerAccount");
    aliyun::Rds::DescribeTasks
              ((RdsDescribeTasksRequestType *)this_00,(RdsDescribeTasksResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_64();
LAB_0012201f:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._0_8_ = local_3d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,
               "{  \"Items\": {    \"VpcZoneId\": [      {        \"ZoneId\": \"ZoneId\",        \"Region\": \"Region\",        \"SubDomain\": \"SubDomain\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"OwnerAccount");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Region");
    std::__cxx11::string::operator=(local_2a8,"ZoneId");
    aliyun::Rds::DescribeVpcZoneNos
              ((RdsDescribeVpcZoneNosRequestType *)this_00,
               (RdsDescribeVpcZoneNosResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_65();
LAB_0012219d:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3b8 + 0x10);
    local_3b8._0_8_ = pRVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,"{  \"DataExtractionLastTime\": \"DataExtractionLastTime\"}","");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != pRVar12) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"BackupId");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ExtractBackupFromOAS
              ((RdsExtractBackupFromOASRequestType *)this_00,
               (RdsExtractBackupFromOASResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_66();
LAB_0012231d:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBName");
    std::__cxx11::string::operator=(local_2a8,"AccountPrivilege");
    std::__cxx11::string::operator=(local_288,"OwnerAccount");
    aliyun::Rds::GrantAccountPrivilege
              ((RdsGrantAccountPrivilegeRequestType *)this_00,
               (RdsGrantAccountPrivilegeResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_67();
LAB_001224aa:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3b8 + 0x10);
    local_3b8._0_8_ = pRVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,"{  \"ImportId\": \"ImportId\"}","");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != pRVar12) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"SourceDBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInfo");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ImportDatabaseBetweenInstances
              ((RdsImportDatabaseBetweenInstancesRequestType *)this_00,
               (RdsImportDatabaseBetweenInstancesResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_68();
LAB_0012262a:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._0_8_ = pRVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"{  \"ImportID\": 0}","");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"FileName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::ImportDataForSQLServer
              ((RdsImportDataForSQLServerRequestType *)this_00,
               (RdsImportDataForSQLServerResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_69();
LAB_00122794:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._0_8_ = pRVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"{  \"ImportId\": 0}","");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"SourceDatabaseIp");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"SourceDatabasePort");
    std::__cxx11::string::operator=(local_2a8,"SourceDatabaseUserName");
    std::__cxx11::string::operator=(local_288,"SourceDatabasePassword");
    std::__cxx11::string::operator=(local_268,"ImportDataType");
    std::__cxx11::string::operator=(local_248,"IsLockTable");
    std::__cxx11::string::operator=((string *)local_228,"SourceDatabaseDBNames");
    std::__cxx11::string::operator=((string *)local_208,"OwnerAccount");
    aliyun::Rds::ImportDataFromDatabase
              ((RdsImportDataFromDatabaseRequestType *)this_00,
               (RdsImportDataFromDatabaseResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_70();
LAB_00122976:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"LockReason");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::LockDBInstance
              ((RdsLockDBInstanceRequestType *)this_00,(RdsLockDBInstanceResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_71();
LAB_00122adb:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"ZoneId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::MigrateToOtherZone
              ((RdsMigrateToOtherZoneRequestType *)this_00,
               (RdsMigrateToOtherZoneResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_72();
LAB_00122c40:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"AccountDescription");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ModifyAccountDescription
              ((RdsModifyAccountDescriptionRequestType *)this_00,
               (RdsModifyAccountDescriptionResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_73();
LAB_00122db9:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"PreferredBackupTime");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"PreferredBackupPeriod");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ModifyBackupPolicy
              ((RdsModifyBackupPolicyRequestType *)this_00,
               (RdsModifyBackupPolicyResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_74();
LAB_00122f32:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"DBName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBDescription");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ModifyDBDescription
              ((RdsModifyDBDescriptionRequestType *)this_00,
               (RdsModifyDBDescriptionResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_75();
LAB_001230ab:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"ConnectionMode");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::ModifyDBInstanceConnectionMode
              ((RdsModifyDBInstanceConnectionModeRequestType *)this_00,
               (RdsModifyDBInstanceConnectionModeResponseType *)local_368,(RdsErrorInfo *)local_3b8)
    ;
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_76();
LAB_00123210:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"CurrentConnectionString");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"ConnectionStringPrefix");
    std::__cxx11::string::operator=(local_2a8,"Port");
    std::__cxx11::string::operator=(local_288,"OwnerAccount");
    aliyun::Rds::ModifyDBInstanceConnectionString
              ((RdsModifyDBInstanceConnectionStringRequestType *)this_00,
               (RdsModifyDBInstanceConnectionStringResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_77();
LAB_0012339d:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceDescription");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ModifyDBInstanceDescription
              ((RdsModifyDBInstanceDescriptionRequestType *)this_00,
               (RdsModifyDBInstanceDescriptionResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_78();
LAB_00123516:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"MaintainTime");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ModifyDBInstanceMaintainTime
              ((RdsModifyDBInstanceMaintainTimeRequestType *)this_00,
               (RdsModifyDBInstanceMaintainTimeResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_79();
LAB_0012368f:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"InstanceNetworkType");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"VPCId");
    std::__cxx11::string::operator=(local_2a8,"VSwitchId");
    std::__cxx11::string::operator=(local_288,"PrivateIpAddress");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::ModifyDBInstanceNetworkType
              ((RdsModifyDBInstanceNetworkTypeRequestType *)this_00,
               (RdsModifyDBInstanceNetworkTypeResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_80();
LAB_00123830:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceClass");
    std::__cxx11::string::operator=(local_2a8,"DBInstanceStorage");
    std::__cxx11::string::operator=(local_288,"PayType");
    std::__cxx11::string::operator=(local_268,"OwnerAccount");
    aliyun::Rds::ModifyDBInstanceSpec
              ((RdsModifyDBInstanceSpecRequestType *)this_00,
               (RdsModifyDBInstanceSpecResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_81();
LAB_001239d1:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"Parameters");
    std::__cxx11::string::operator=(local_2a8,"Forcerestart");
    std::__cxx11::string::operator=(local_288,"OwnerAccount");
    aliyun::Rds::ModifyParameter
              ((RdsModifyParameterRequestType *)this_00,(RdsModifyParameterResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_82();
LAB_00123b5e:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceClass");
    std::__cxx11::string::operator=(local_2a8,"DBInstanceStorage");
    std::__cxx11::string::operator=(local_288,"OwnerAccount");
    aliyun::Rds::ModifyPostpaidDBInstanceSpec
              ((RdsModifyPostpaidDBInstanceSpecRequestType *)this_00,
               (RdsModifyPostpaidDBInstanceSpecResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_83();
LAB_00123ceb:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"SecurityIps");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ModifySecurityIps
              ((RdsModifySecurityIpsRequestType *)this_00,
               (RdsModifySecurityIpsResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_84();
LAB_00123e64:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3b8 + 0x10);
    local_3b8._0_8_ = pRVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,"{  \"PreCheckId\": \"PreCheckId\"}","");
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != pRVar12) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"SourceDatabaseIp");
    std::__cxx11::string::operator=(local_2a8,"SourceDatabasePort");
    std::__cxx11::string::operator=(local_288,"SourceDatabaseUserName");
    std::__cxx11::string::operator=(local_268,"SourceDatabasePassword");
    std::__cxx11::string::operator=(local_248,"ImportDataType");
    std::__cxx11::string::operator=((string *)local_228,"SourceDatabaseDBNames");
    std::__cxx11::string::operator=((string *)local_208,"OwnerAccount");
    aliyun::Rds::PreCheckBeforeImportData
              ((RdsPreCheckBeforeImportDataRequestType *)this_00,
               (RdsPreCheckBeforeImportDataResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_85();
LAB_00124048:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::PurgeDBInstanceLog
              ((RdsPurgeDBInstanceLogRequestType *)this_00,
               (RdsPurgeDBInstanceLogResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_86();
LAB_001241ad:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"CurrentConnectionString");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::ReleaseInstancePublicConnection
              ((RdsReleaseInstancePublicConnectionRequestType *)this_00,
               (RdsReleaseInstancePublicConnectionResponseType *)local_368,(RdsErrorInfo *)local_3b8
              );
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_87();
LAB_00124312:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"proxyId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceId");
    std::__cxx11::string::operator=(local_2a8,"Tag.1.key");
    std::__cxx11::string::operator=(local_288,"Tag.2.key");
    std::__cxx11::string::operator=(local_268,"Tag.3.key");
    std::__cxx11::string::operator=(local_248,"Tag.4.key");
    std::__cxx11::string::operator=((string *)local_228,"Tag.5.key");
    std::__cxx11::string::operator=((string *)local_208,"Tag.1.value");
    std::__cxx11::string::operator=((string *)&local_1e8,"Tag.2.value");
    std::__cxx11::string::operator=((string *)&local_1c8,"Tag.3.value");
    std::__cxx11::string::operator=((string *)&local_1a8,"Tag.4.value");
    std::__cxx11::string::operator=((string *)&local_188,"Tag.5.value");
    std::__cxx11::string::operator=((string *)&local_168,"OwnerAccount");
    aliyun::Rds::RemoveTagsFromResource
              (this_00,(RdsRemoveTagsFromResourceResponseType *)local_368,(RdsErrorInfo *)local_3b8)
    ;
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_88();
LAB_00124553:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"AccountPassword");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ResetAccountForPG
              ((RdsResetAccountForPGRequestType *)this_00,
               (RdsResetAccountForPGResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_89();
LAB_001246cc:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"AccountPassword");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::ResetAccountPassword
              ((RdsResetAccountPasswordRequestType *)this_00,
               (RdsResetAccountPasswordResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_90();
LAB_00124845:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"OwnerAccount");
    aliyun::Rds::RestartDBInstance
              ((RdsRestartDBInstanceRequestType *)this_00,
               (RdsRestartDBInstanceResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_91();
LAB_001249aa:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"BackupId");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::RestoreDBInstance
              ((RdsRestoreDBInstanceRequestType *)this_00,
               (RdsRestoreDBInstanceResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_92();
LAB_00124b23:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = local_3d8 + 0x10;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2e8,"AccountName");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBName");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::RevokeAccountPrivilege
              ((RdsRevokeAccountPrivilegeRequestType *)this_00,
               (RdsRevokeAccountPrivilegeResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_93();
LAB_00124c9c:
    local_3d8._16_2_ = 0x3231;
    local_3d8[0x12] = '7';
    local_3d8._19_4_ = 0x302e302e;
    local_3d8[0x17] = '.';
    local_3d8._24_7_ = 0x34333232313a31;
    local_3d8._8_8_ = 0xf;
    local_3d8[0x1f] = '\0';
    local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3b8 + 0x10);
    local_3b8._0_8_ = pRVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b8,
               "{  \"DBInstanceName\": \"DBInstanceName\",  \"DBInstanceId\": \"DBInstanceId\"}","")
    ;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
    if ((pointer)local_3b8._0_8_ != pRVar12) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"proxyId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"DBInstanceId");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::StartDBInstanceDiagnose
              ((RdsStartDBInstanceDiagnoseRequestType *)this_00,
               (RdsStartDBInstanceDiagnoseResponseType *)local_368,
               (RdsErrorInfo *)local_e8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_94();
LAB_00124e1c:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"ImportId");
    std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
    aliyun::Rds::StopSyncing
              ((RdsStopSyncingRequestType *)this_00,(RdsStopSyncingResponseType *)local_368,
               (RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_95();
LAB_00124f95:
    local_380._0_7_ = 0x302e302e373231;
    local_380[7] = '.';
    local_380[8] = '1';
    local_380[9] = ':';
    local_380._10_5_ = 0x3433323231;
    local_390._8_8_ = 0xf;
    local_380[0xf] = '\0';
    local_390._0_8_ = pRVar12;
    aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
    if ((pointer)local_390._0_8_ != pRVar12) {
      operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
    }
    if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar10 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar10,0x2fca);
    pRVar12 = (pointer)(local_3d8 + 0x10);
    local_3d8._16_2_ = 0x7d7b;
    local_3d8._8_8_ = 2;
    local_3d8[0x12] = '\0';
    local_3d8._0_8_ = pRVar12;
    HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pRVar12) {
      operator_delete((void *)local_3d8._0_8_,
                      CONCAT17(local_3d8[0x17],
                               CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar10);
    std::__cxx11::string::operator=((string *)local_368,"OwnerId");
    std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_308,"ClientToken");
    std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
    std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"ConnectionStringPrefix");
    std::__cxx11::string::operator=(local_2a8,"Port");
    std::__cxx11::string::operator=(local_288,"OwnerAccount");
    aliyun::Rds::SwitchDBInstanceNetType
              ((RdsSwitchDBInstanceNetTypeRequestType *)this_00,
               (RdsSwitchDBInstanceNetTypeResponseType *)local_368,(RdsErrorInfo *)local_3b8);
    HttpTestListener::WaitComplete(pHVar10);
    main_cold_96();
  }
  local_380._0_7_ = 0x302e302e373231;
  local_380[7] = '.';
  local_380[8] = '1';
  local_380[9] = ':';
  local_380._10_5_ = 0x3433323231;
  local_390._8_8_ = 0xf;
  local_380[0xf] = '\0';
  local_390._0_8_ = pRVar12;
  aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_390);
  if ((pointer)local_390._0_8_ != pRVar12) {
    operator_delete((void *)local_390._0_8_,CONCAT17(local_380[7],local_380._0_7_) + 1);
  }
  if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar10 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar10,0x2fca);
  local_3d8._16_2_ = 0x7d7b;
  local_3d8._8_8_ = 2;
  local_3d8[0x12] = '\0';
  local_3d8._0_8_ = local_3d8 + 0x10;
  HttpTestListener::SetResponseBody(pHVar10,(string *)local_3d8);
  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
    operator_delete((void *)local_3d8._0_8_,
                    CONCAT17(local_3d8[0x17],
                             CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_)))
                    + 1);
  }
  HttpTestListener::Start(pHVar10);
  std::__cxx11::string::operator=((string *)local_368,"OwnerId");
  std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)local_308,"DBInstanceId");
  std::__cxx11::string::operator=((string *)local_2e8,"OwnerAccount");
  aliyun::Rds::UnlockDBInstance
            ((RdsUnlockDBInstanceRequestType *)this_00,(RdsUnlockDBInstanceResponseType *)local_368,
             (RdsErrorInfo *)local_3b8);
  HttpTestListener::WaitComplete(pHVar10);
  main_cold_97();
LAB_00125273:
  local_3d8._16_2_ = 0x3231;
  local_3d8[0x12] = '7';
  local_3d8._19_4_ = 0x302e302e;
  local_3d8[0x17] = '.';
  local_3d8._24_7_ = 0x34333232313a31;
  local_3d8._8_8_ = 0xf;
  local_3d8[0x1f] = '\0';
  local_3d8._0_8_ = local_3d8 + 0x10;
  aliyun::Rds::SetProxyHost((Rds *)this_00,(string *)local_3d8);
  if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
    operator_delete((void *)local_3d8._0_8_,
                    CONCAT17(local_3d8[0x17],
                             CONCAT43(local_3d8._19_4_,CONCAT12(local_3d8[0x12],local_3d8._16_2_)))
                    + 1);
  }
  if ((char)(this_00->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this_00->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar10 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar10,0x2fca);
  local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3b8,"{  \"TaskId\": \"TaskId\"}","");
  HttpTestListener::SetResponseBody(pHVar10,(string *)local_3b8);
  if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
    operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
  }
  HttpTestListener::Start(pHVar10);
  std::__cxx11::string::operator=((string *)local_368,"OwnerId");
  std::__cxx11::string::operator=((string *)(local_368 + 0x20),"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)local_328,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)local_308,"ClientToken");
  std::__cxx11::string::operator=((string *)local_2e8,"DBInstanceId");
  std::__cxx11::string::operator=((string *)local_2c8._M_local_buf,"EngineVersion");
  std::__cxx11::string::operator=(local_2a8,"OwnerAccount");
  aliyun::Rds::UpgradeDBInstanceEngineVersion
            ((RdsUpgradeDBInstanceEngineVersionRequestType *)this_00,
             (RdsUpgradeDBInstanceEngineVersionResponseType *)local_368,
             (RdsErrorInfo *)local_e8._M_local_buf);
  HttpTestListener::WaitComplete(pHVar10);
  main_cold_98();
  aliyun::RdsCreateDBInstanceResponseType::~RdsCreateDBInstanceResponseType
            ((RdsCreateDBInstanceResponseType *)&local_e8);
  aliyun::RdsCreateDBInstanceRequestType::~RdsCreateDBInstanceRequestType
            ((RdsCreateDBInstanceRequestType *)local_368);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static int test_create_account() {
  RdsCreateAccountRequestType req;
  RdsCreateAccountResponseType resp;
  Rds* rds = Rds::CreateRdsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!rds) return 0;
  rds->SetProxyHost("127.0.0.1:12234");
  rds->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_create_account_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.db_instance_id = "DBInstanceId";
  req.account_name = "AccountName";
  req.account_password = "AccountPassword";
  req.account_description = "AccountDescription";
  req.owner_account = "OwnerAccount";
  int ret = rds->CreateAccount(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete rds;
}